

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  Geometry *pGVar11;
  long lVar12;
  __int_type_conflict _Var13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  bool bVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  uint uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar74 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar105 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float t1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar188;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar192;
  float fVar213;
  float fVar214;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar208 [32];
  float fVar215;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [32];
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar238 [16];
  vfloat4 b0;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar287;
  float fVar288;
  vfloat4 a0_1;
  float fVar289;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float pp;
  float fVar290;
  float fVar302;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar300;
  float fVar301;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [64];
  float fVar303;
  float fVar309;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar312;
  float in_register_0000151c;
  undefined1 auVar306 [32];
  float fVar313;
  float fVar314;
  float fVar322;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar320;
  float fVar321;
  undefined1 auVar319 [32];
  float fVar323;
  float fVar324;
  float fVar332;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float fVar330;
  float fVar331;
  float in_register_0000159c;
  undefined1 auVar328 [32];
  float fVar334;
  vfloat4 a0;
  undefined1 auVar333 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  uint auStack_4b0 [4];
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar233 [32];
  undefined1 auVar329 [32];
  
  PVar10 = prim[1];
  uVar66 = (ulong)(byte)PVar10;
  lVar71 = uVar66 * 5;
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar224 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar224 = vinsertps_avx(auVar224,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar192 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar100._0_4_ = fVar192 * auVar78._0_4_;
  auVar100._4_4_ = fVar192 * auVar78._4_4_;
  auVar100._8_4_ = fVar192 * auVar78._8_4_;
  auVar100._12_4_ = fVar192 * auVar78._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 10)));
  auVar193._0_4_ = fVar192 * auVar224._0_4_;
  auVar193._4_4_ = fVar192 * auVar224._4_4_;
  auVar193._8_4_ = fVar192 * auVar224._8_4_;
  auVar193._12_4_ = fVar192 * auVar224._12_4_;
  auVar89._16_16_ = auVar150;
  auVar89._0_16_ = auVar78;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 10)));
  auVar152._16_16_ = auVar224;
  auVar152._0_16_ = auVar78;
  auVar15 = vcvtdq2ps_avx(auVar152);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 10)));
  auVar163._16_16_ = auVar224;
  auVar163._0_16_ = auVar78;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 10)));
  auVar16 = vcvtdq2ps_avx(auVar163);
  auVar164._16_16_ = auVar224;
  auVar164._0_16_ = auVar78;
  auVar17 = vcvtdq2ps_avx(auVar164);
  uVar68 = (ulong)((uint)(byte)PVar10 * 0xc);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar231._16_16_ = auVar224;
  auVar231._0_16_ = auVar78;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar231);
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 10)));
  auVar248._16_16_ = auVar224;
  auVar248._0_16_ = auVar78;
  lVar1 = uVar66 * 9;
  uVar68 = (ulong)(uint)((int)lVar1 * 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar248);
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar249._16_16_ = auVar224;
  auVar249._0_16_ = auVar78;
  auVar20 = vcvtdq2ps_avx(auVar249);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 10)));
  auVar276._16_16_ = auVar224;
  auVar276._0_16_ = auVar78;
  uVar68 = (ulong)(uint)((int)lVar71 << 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar21 = vcvtdq2ps_avx(auVar276);
  auVar284._16_16_ = auVar224;
  auVar284._0_16_ = auVar78;
  auVar22 = vcvtdq2ps_avx(auVar284);
  auVar78 = vshufps_avx(auVar193,auVar193,0);
  auVar224 = vshufps_avx(auVar193,auVar193,0x55);
  auVar150 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar192 = auVar150._0_4_;
  fVar219 = auVar150._4_4_;
  fVar213 = auVar150._8_4_;
  fVar234 = auVar150._12_4_;
  fVar214 = auVar224._0_4_;
  fVar235 = auVar224._4_4_;
  fVar215 = auVar224._8_4_;
  fVar236 = auVar224._12_4_;
  fVar216 = auVar78._0_4_;
  fVar237 = auVar78._4_4_;
  fVar217 = auVar78._8_4_;
  fVar239 = auVar78._12_4_;
  auVar306._0_4_ = fVar216 * auVar89._0_4_ + fVar214 * auVar15._0_4_ + fVar192 * auVar16._0_4_;
  auVar306._4_4_ = fVar237 * auVar89._4_4_ + fVar235 * auVar15._4_4_ + fVar219 * auVar16._4_4_;
  auVar306._8_4_ = fVar217 * auVar89._8_4_ + fVar215 * auVar15._8_4_ + fVar213 * auVar16._8_4_;
  auVar306._12_4_ = fVar239 * auVar89._12_4_ + fVar236 * auVar15._12_4_ + fVar234 * auVar16._12_4_;
  auVar306._16_4_ = fVar216 * auVar89._16_4_ + fVar214 * auVar15._16_4_ + fVar192 * auVar16._16_4_;
  auVar306._20_4_ = fVar237 * auVar89._20_4_ + fVar235 * auVar15._20_4_ + fVar219 * auVar16._20_4_;
  auVar306._24_4_ = fVar217 * auVar89._24_4_ + fVar215 * auVar15._24_4_ + fVar213 * auVar16._24_4_;
  auVar306._28_4_ = fVar236 + in_register_000015dc + in_register_0000151c;
  auVar296._0_4_ = fVar216 * auVar17._0_4_ + fVar214 * auVar18._0_4_ + auVar19._0_4_ * fVar192;
  auVar296._4_4_ = fVar237 * auVar17._4_4_ + fVar235 * auVar18._4_4_ + auVar19._4_4_ * fVar219;
  auVar296._8_4_ = fVar217 * auVar17._8_4_ + fVar215 * auVar18._8_4_ + auVar19._8_4_ * fVar213;
  auVar296._12_4_ = fVar239 * auVar17._12_4_ + fVar236 * auVar18._12_4_ + auVar19._12_4_ * fVar234;
  auVar296._16_4_ = fVar216 * auVar17._16_4_ + fVar214 * auVar18._16_4_ + auVar19._16_4_ * fVar192;
  auVar296._20_4_ = fVar237 * auVar17._20_4_ + fVar235 * auVar18._20_4_ + auVar19._20_4_ * fVar219;
  auVar296._24_4_ = fVar217 * auVar17._24_4_ + fVar215 * auVar18._24_4_ + auVar19._24_4_ * fVar213;
  auVar296._28_4_ = fVar236 + in_register_000015dc + in_register_0000159c;
  auVar208._0_4_ = fVar216 * auVar20._0_4_ + fVar214 * auVar21._0_4_ + auVar22._0_4_ * fVar192;
  auVar208._4_4_ = fVar237 * auVar20._4_4_ + fVar235 * auVar21._4_4_ + auVar22._4_4_ * fVar219;
  auVar208._8_4_ = fVar217 * auVar20._8_4_ + fVar215 * auVar21._8_4_ + auVar22._8_4_ * fVar213;
  auVar208._12_4_ = fVar239 * auVar20._12_4_ + fVar236 * auVar21._12_4_ + auVar22._12_4_ * fVar234;
  auVar208._16_4_ = fVar216 * auVar20._16_4_ + fVar214 * auVar21._16_4_ + auVar22._16_4_ * fVar192;
  auVar208._20_4_ = fVar237 * auVar20._20_4_ + fVar235 * auVar21._20_4_ + auVar22._20_4_ * fVar219;
  auVar208._24_4_ = fVar217 * auVar20._24_4_ + fVar215 * auVar21._24_4_ + auVar22._24_4_ * fVar213;
  auVar208._28_4_ = fVar239 + fVar236 + fVar234;
  auVar78 = vshufps_avx(auVar100,auVar100,0);
  auVar224 = vshufps_avx(auVar100,auVar100,0x55);
  auVar150 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar219 = auVar150._0_4_;
  fVar213 = auVar150._4_4_;
  fVar234 = auVar150._8_4_;
  fVar214 = auVar150._12_4_;
  fVar237 = auVar224._0_4_;
  fVar217 = auVar224._4_4_;
  fVar239 = auVar224._8_4_;
  fVar218 = auVar224._12_4_;
  fVar235 = auVar78._0_4_;
  fVar215 = auVar78._4_4_;
  fVar236 = auVar78._8_4_;
  fVar216 = auVar78._12_4_;
  fVar192 = auVar89._28_4_;
  auVar123._0_4_ = fVar235 * auVar89._0_4_ + fVar237 * auVar15._0_4_ + fVar219 * auVar16._0_4_;
  auVar123._4_4_ = fVar215 * auVar89._4_4_ + fVar217 * auVar15._4_4_ + fVar213 * auVar16._4_4_;
  auVar123._8_4_ = fVar236 * auVar89._8_4_ + fVar239 * auVar15._8_4_ + fVar234 * auVar16._8_4_;
  auVar123._12_4_ = fVar216 * auVar89._12_4_ + fVar218 * auVar15._12_4_ + fVar214 * auVar16._12_4_;
  auVar123._16_4_ = fVar235 * auVar89._16_4_ + fVar237 * auVar15._16_4_ + fVar219 * auVar16._16_4_;
  auVar123._20_4_ = fVar215 * auVar89._20_4_ + fVar217 * auVar15._20_4_ + fVar213 * auVar16._20_4_;
  auVar123._24_4_ = fVar236 * auVar89._24_4_ + fVar239 * auVar15._24_4_ + fVar234 * auVar16._24_4_;
  auVar123._28_4_ = fVar192 + auVar15._28_4_ + auVar16._28_4_;
  auVar153._0_4_ = fVar235 * auVar17._0_4_ + auVar19._0_4_ * fVar219 + fVar237 * auVar18._0_4_;
  auVar153._4_4_ = fVar215 * auVar17._4_4_ + auVar19._4_4_ * fVar213 + fVar217 * auVar18._4_4_;
  auVar153._8_4_ = fVar236 * auVar17._8_4_ + auVar19._8_4_ * fVar234 + fVar239 * auVar18._8_4_;
  auVar153._12_4_ = fVar216 * auVar17._12_4_ + auVar19._12_4_ * fVar214 + fVar218 * auVar18._12_4_;
  auVar153._16_4_ = fVar235 * auVar17._16_4_ + auVar19._16_4_ * fVar219 + fVar237 * auVar18._16_4_;
  auVar153._20_4_ = fVar215 * auVar17._20_4_ + auVar19._20_4_ * fVar213 + fVar217 * auVar18._20_4_;
  auVar153._24_4_ = fVar236 * auVar17._24_4_ + auVar19._24_4_ * fVar234 + fVar239 * auVar18._24_4_;
  auVar153._28_4_ = fVar192 + auVar19._28_4_ + auVar16._28_4_;
  auVar165._8_4_ = 0x7fffffff;
  auVar165._0_8_ = 0x7fffffff7fffffff;
  auVar165._12_4_ = 0x7fffffff;
  auVar165._16_4_ = 0x7fffffff;
  auVar165._20_4_ = 0x7fffffff;
  auVar165._24_4_ = 0x7fffffff;
  auVar165._28_4_ = 0x7fffffff;
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar183._16_4_ = 0x219392ef;
  auVar183._20_4_ = 0x219392ef;
  auVar183._24_4_ = 0x219392ef;
  auVar183._28_4_ = 0x219392ef;
  auVar89 = vandps_avx(auVar306,auVar165);
  auVar89 = vcmpps_avx(auVar89,auVar183,1);
  auVar15 = vblendvps_avx(auVar306,auVar183,auVar89);
  auVar89 = vandps_avx(auVar296,auVar165);
  auVar89 = vcmpps_avx(auVar89,auVar183,1);
  auVar16 = vblendvps_avx(auVar296,auVar183,auVar89);
  auVar89 = vandps_avx(auVar208,auVar165);
  auVar89 = vcmpps_avx(auVar89,auVar183,1);
  auVar89 = vblendvps_avx(auVar208,auVar183,auVar89);
  auVar166._0_4_ = fVar235 * auVar20._0_4_ + fVar237 * auVar21._0_4_ + auVar22._0_4_ * fVar219;
  auVar166._4_4_ = fVar215 * auVar20._4_4_ + fVar217 * auVar21._4_4_ + auVar22._4_4_ * fVar213;
  auVar166._8_4_ = fVar236 * auVar20._8_4_ + fVar239 * auVar21._8_4_ + auVar22._8_4_ * fVar234;
  auVar166._12_4_ = fVar216 * auVar20._12_4_ + fVar218 * auVar21._12_4_ + auVar22._12_4_ * fVar214;
  auVar166._16_4_ = fVar235 * auVar20._16_4_ + fVar237 * auVar21._16_4_ + auVar22._16_4_ * fVar219;
  auVar166._20_4_ = fVar215 * auVar20._20_4_ + fVar217 * auVar21._20_4_ + auVar22._20_4_ * fVar213;
  auVar166._24_4_ = fVar236 * auVar20._24_4_ + fVar239 * auVar21._24_4_ + auVar22._24_4_ * fVar234;
  auVar166._28_4_ = fVar192 + auVar18._28_4_ + fVar214;
  auVar17 = vrcpps_avx(auVar15);
  fVar192 = auVar17._0_4_;
  fVar213 = auVar17._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar213;
  auVar18._0_4_ = auVar15._0_4_ * fVar192;
  fVar214 = auVar17._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar214;
  fVar215 = auVar17._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar215;
  fVar216 = auVar17._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar216;
  fVar217 = auVar17._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar217;
  fVar218 = auVar17._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar218;
  auVar18._28_4_ = auVar208._28_4_;
  auVar250._8_4_ = 0x3f800000;
  auVar250._0_8_ = 0x3f8000003f800000;
  auVar250._12_4_ = 0x3f800000;
  auVar250._16_4_ = 0x3f800000;
  auVar250._20_4_ = 0x3f800000;
  auVar250._24_4_ = 0x3f800000;
  auVar250._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar250,auVar18);
  auVar15 = vrcpps_avx(auVar16);
  fVar192 = fVar192 + fVar192 * auVar18._0_4_;
  fVar213 = fVar213 + fVar213 * auVar18._4_4_;
  fVar214 = fVar214 + fVar214 * auVar18._8_4_;
  fVar215 = fVar215 + fVar215 * auVar18._12_4_;
  fVar216 = fVar216 + fVar216 * auVar18._16_4_;
  fVar217 = fVar217 + fVar217 * auVar18._20_4_;
  fVar218 = fVar218 + fVar218 * auVar18._24_4_;
  fVar219 = auVar15._0_4_;
  fVar234 = auVar15._4_4_;
  auVar19._4_4_ = auVar16._4_4_ * fVar234;
  auVar19._0_4_ = auVar16._0_4_ * fVar219;
  fVar235 = auVar15._8_4_;
  auVar19._8_4_ = auVar16._8_4_ * fVar235;
  fVar236 = auVar15._12_4_;
  auVar19._12_4_ = auVar16._12_4_ * fVar236;
  fVar237 = auVar15._16_4_;
  auVar19._16_4_ = auVar16._16_4_ * fVar237;
  fVar239 = auVar15._20_4_;
  auVar19._20_4_ = auVar16._20_4_ * fVar239;
  fVar240 = auVar15._24_4_;
  auVar19._24_4_ = auVar16._24_4_ * fVar240;
  auVar19._28_4_ = auVar17._28_4_;
  auVar15 = vsubps_avx(auVar250,auVar19);
  fVar219 = fVar219 + fVar219 * auVar15._0_4_;
  fVar234 = fVar234 + fVar234 * auVar15._4_4_;
  fVar235 = fVar235 + fVar235 * auVar15._8_4_;
  fVar236 = fVar236 + fVar236 * auVar15._12_4_;
  fVar237 = fVar237 + fVar237 * auVar15._16_4_;
  fVar239 = fVar239 + fVar239 * auVar15._20_4_;
  fVar240 = fVar240 + fVar240 * auVar15._24_4_;
  auVar15 = vrcpps_avx(auVar89);
  fVar168 = auVar15._0_4_;
  fVar186 = auVar15._4_4_;
  auVar16._4_4_ = fVar186 * auVar89._4_4_;
  auVar16._0_4_ = fVar168 * auVar89._0_4_;
  fVar187 = auVar15._8_4_;
  auVar16._8_4_ = fVar187 * auVar89._8_4_;
  fVar188 = auVar15._12_4_;
  auVar16._12_4_ = fVar188 * auVar89._12_4_;
  fVar189 = auVar15._16_4_;
  auVar16._16_4_ = fVar189 * auVar89._16_4_;
  fVar190 = auVar15._20_4_;
  auVar16._20_4_ = fVar190 * auVar89._20_4_;
  fVar191 = auVar15._24_4_;
  auVar16._24_4_ = fVar191 * auVar89._24_4_;
  auVar16._28_4_ = auVar89._28_4_;
  auVar89 = vsubps_avx(auVar250,auVar16);
  fVar168 = fVar168 + fVar168 * auVar89._0_4_;
  fVar186 = fVar186 + fVar186 * auVar89._4_4_;
  fVar187 = fVar187 + fVar187 * auVar89._8_4_;
  fVar188 = fVar188 + fVar188 * auVar89._12_4_;
  fVar189 = fVar189 + fVar189 * auVar89._16_4_;
  fVar190 = fVar190 + fVar190 * auVar89._20_4_;
  fVar191 = fVar191 + fVar191 * auVar89._24_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *(ulong *)(prim + uVar66 * 7 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar224);
  auVar90._16_16_ = auVar224;
  auVar90._0_16_ = auVar78;
  auVar89 = vcvtdq2ps_avx(auVar90);
  auVar89 = vsubps_avx(auVar89,auVar123);
  auVar73._0_4_ = fVar192 * auVar89._0_4_;
  auVar73._4_4_ = fVar213 * auVar89._4_4_;
  auVar73._8_4_ = fVar214 * auVar89._8_4_;
  auVar73._12_4_ = fVar215 * auVar89._12_4_;
  auVar17._16_4_ = fVar216 * auVar89._16_4_;
  auVar17._0_16_ = auVar73;
  auVar17._20_4_ = fVar217 * auVar89._20_4_;
  auVar17._24_4_ = fVar218 * auVar89._24_4_;
  auVar17._28_4_ = auVar89._28_4_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + lVar1 + 6);
  auVar78 = vpmovsxwd_avx(auVar150);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar1 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar6);
  auVar251._16_16_ = auVar224;
  auVar251._0_16_ = auVar78;
  auVar89 = vcvtdq2ps_avx(auVar251);
  auVar89 = vsubps_avx(auVar89,auVar123);
  auVar101._0_4_ = fVar192 * auVar89._0_4_;
  auVar101._4_4_ = fVar213 * auVar89._4_4_;
  auVar101._8_4_ = fVar214 * auVar89._8_4_;
  auVar101._12_4_ = fVar215 * auVar89._12_4_;
  auVar20._16_4_ = fVar216 * auVar89._16_4_;
  auVar20._0_16_ = auVar101;
  auVar20._20_4_ = fVar217 * auVar89._20_4_;
  auVar20._24_4_ = fVar218 * auVar89._24_4_;
  auVar20._28_4_ = auVar89._28_4_;
  lVar71 = (ulong)(byte)PVar10 * 0x10;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar78 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar8);
  lVar71 = lVar71 + uVar66 * -2;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar150 = vpmovsxwd_avx(auVar118);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar6 = vpmovsxwd_avx(auVar107);
  auVar209._16_16_ = auVar6;
  auVar209._0_16_ = auVar150;
  auVar89 = vcvtdq2ps_avx(auVar209);
  auVar89 = vsubps_avx(auVar89,auVar153);
  auVar194._0_4_ = fVar219 * auVar89._0_4_;
  auVar194._4_4_ = fVar234 * auVar89._4_4_;
  auVar194._8_4_ = fVar235 * auVar89._8_4_;
  auVar194._12_4_ = fVar236 * auVar89._12_4_;
  auVar21._16_4_ = fVar237 * auVar89._16_4_;
  auVar21._0_16_ = auVar194;
  auVar21._20_4_ = fVar239 * auVar89._20_4_;
  auVar21._24_4_ = fVar240 * auVar89._24_4_;
  auVar21._28_4_ = auVar89._28_4_;
  auVar252._16_16_ = auVar224;
  auVar252._0_16_ = auVar78;
  auVar89 = vcvtdq2ps_avx(auVar252);
  auVar89 = vsubps_avx(auVar89,auVar153);
  auVar132._0_4_ = fVar219 * auVar89._0_4_;
  auVar132._4_4_ = fVar234 * auVar89._4_4_;
  auVar132._8_4_ = fVar235 * auVar89._8_4_;
  auVar132._12_4_ = fVar236 * auVar89._12_4_;
  auVar22._16_4_ = fVar237 * auVar89._16_4_;
  auVar22._0_16_ = auVar132;
  auVar22._20_4_ = fVar239 * auVar89._20_4_;
  auVar22._24_4_ = fVar240 * auVar89._24_4_;
  auVar22._28_4_ = auVar89._28_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar68 + uVar66 + 6);
  auVar78 = vpmovsxwd_avx(auVar140);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar68 + uVar66 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar108);
  auVar232._16_16_ = auVar224;
  auVar232._0_16_ = auVar78;
  auVar89 = vcvtdq2ps_avx(auVar232);
  auVar89 = vsubps_avx(auVar89,auVar166);
  auVar220._0_4_ = fVar168 * auVar89._0_4_;
  auVar220._4_4_ = fVar186 * auVar89._4_4_;
  auVar220._8_4_ = fVar187 * auVar89._8_4_;
  auVar220._12_4_ = fVar188 * auVar89._12_4_;
  auVar23._16_4_ = fVar189 * auVar89._16_4_;
  auVar23._0_16_ = auVar220;
  auVar23._20_4_ = fVar190 * auVar89._20_4_;
  auVar23._24_4_ = fVar191 * auVar89._24_4_;
  auVar23._28_4_ = auVar89._28_4_;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar78 = vpmovsxwd_avx(auVar238);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar9);
  auVar253._16_16_ = auVar224;
  auVar253._0_16_ = auVar78;
  auVar89 = vcvtdq2ps_avx(auVar253);
  auVar89 = vsubps_avx(auVar89,auVar166);
  auVar158._0_4_ = fVar168 * auVar89._0_4_;
  auVar158._4_4_ = fVar186 * auVar89._4_4_;
  auVar158._8_4_ = fVar187 * auVar89._8_4_;
  auVar158._12_4_ = fVar188 * auVar89._12_4_;
  auVar24._16_4_ = fVar189 * auVar89._16_4_;
  auVar24._0_16_ = auVar158;
  auVar24._20_4_ = fVar190 * auVar89._20_4_;
  auVar24._24_4_ = fVar191 * auVar89._24_4_;
  auVar24._28_4_ = auVar89._28_4_;
  auVar78 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar224 = vpminsd_avx(auVar73,auVar101);
  auVar285._16_16_ = auVar78;
  auVar285._0_16_ = auVar224;
  auVar78 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar224 = vpminsd_avx(auVar194,auVar132);
  auVar297._16_16_ = auVar78;
  auVar297._0_16_ = auVar224;
  auVar89 = vmaxps_avx(auVar285,auVar297);
  auVar78 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar224 = vpminsd_avx(auVar220,auVar158);
  auVar319._16_16_ = auVar78;
  auVar319._0_16_ = auVar224;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar328._4_4_ = uVar4;
  auVar328._0_4_ = uVar4;
  auVar328._8_4_ = uVar4;
  auVar328._12_4_ = uVar4;
  auVar328._16_4_ = uVar4;
  auVar328._20_4_ = uVar4;
  auVar328._24_4_ = uVar4;
  auVar328._28_4_ = uVar4;
  auVar15 = vmaxps_avx(auVar319,auVar328);
  auVar89 = vmaxps_avx(auVar89,auVar15);
  local_2e0._4_4_ = auVar89._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar89._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar89._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar89._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar89._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar89._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar89._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar89._28_4_;
  auVar78 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar224 = vpmaxsd_avx(auVar73,auVar101);
  auVar91._16_16_ = auVar78;
  auVar91._0_16_ = auVar224;
  auVar78 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar224 = vpmaxsd_avx(auVar194,auVar132);
  auVar124._16_16_ = auVar78;
  auVar124._0_16_ = auVar224;
  auVar89 = vminps_avx(auVar91,auVar124);
  auVar78 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar224 = vpmaxsd_avx(auVar220,auVar158);
  auVar125._16_16_ = auVar78;
  auVar125._0_16_ = auVar224;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar154._4_4_ = uVar4;
  auVar154._0_4_ = uVar4;
  auVar154._8_4_ = uVar4;
  auVar154._12_4_ = uVar4;
  auVar154._16_4_ = uVar4;
  auVar154._20_4_ = uVar4;
  auVar154._24_4_ = uVar4;
  auVar154._28_4_ = uVar4;
  auVar15 = vminps_avx(auVar125,auVar154);
  auVar89 = vminps_avx(auVar89,auVar15);
  auVar15._4_4_ = auVar89._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar89._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar89._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar89._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar89._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar89._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar89._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar89._28_4_;
  auVar89 = vcmpps_avx(local_2e0,auVar15,2);
  auVar78 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar126._16_16_ = auVar78;
  auVar126._0_16_ = auVar78;
  auVar15 = vcvtdq2ps_avx(auVar126);
  auVar15 = vcmpps_avx(_DAT_01faff40,auVar15,1);
  auVar89 = vandps_avx(auVar89,auVar15);
  uVar65 = vmovmskps_avx(auVar89);
  if (uVar65 == 0) {
    return false;
  }
  uVar65 = uVar65 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  uVar69 = 1 << ((byte)k & 0x1f);
  local_2c0 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
LAB_0106b2fa:
  lVar71 = 0;
  if (uVar65 != 0) {
    for (; (uVar65 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar11 = (context->scene->geometries).items[uVar67].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           (ulong)*(uint *)(prim + lVar71 * 4 + 6) *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar12 + (long)pGVar11[1].intersectionFilterN * uVar66);
  fVar216 = *pfVar2;
  fVar237 = pfVar2[1];
  fVar217 = pfVar2[2];
  fVar239 = pfVar2[3];
  lVar1 = uVar66 + 1;
  auVar78 = *(undefined1 (*) [16])(lVar12 + (long)pGVar11[1].intersectionFilterN * lVar1);
  pfVar2 = (float *)(pGVar11[2].intersectionFilterN + (long)pGVar11[2].pointQueryFunc * uVar66);
  _Var13 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(pGVar11[2].intersectionFilterN + (long)pGVar11[2].pointQueryFunc * lVar1);
  auVar133._0_4_ = *pfVar3 * 0.33333334;
  auVar133._4_4_ = pfVar3[1] * 0.33333334;
  auVar133._8_4_ = pfVar3[2] * 0.33333334;
  auVar133._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)(_Var13 + (long)pGVar11[2].userPtr * uVar66);
  fVar218 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar168 = pfVar3[2];
  fVar186 = pfVar3[3];
  auVar224 = *(undefined1 (*) [16])(_Var13 + (long)pGVar11[2].userPtr * lVar1);
  pfVar3 = (float *)((long)pGVar11[3].userPtr + uVar66 * *(long *)&pGVar11[3].fnumTimeSegments);
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar6 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar187 = fVar216 + *pfVar2 * 0.33333334;
  fVar188 = fVar237 + pfVar2[1] * 0.33333334;
  fVar189 = fVar217 + pfVar2[2] * 0.33333334;
  fVar190 = fVar239 + pfVar2[3] * 0.33333334;
  auVar150 = vsubps_avx(auVar78,auVar133);
  pfVar2 = (float *)((long)pGVar11[3].userPtr + *(long *)&pGVar11[3].fnumTimeSegments * lVar1);
  auVar102._0_4_ = *pfVar2 * 0.33333334;
  auVar102._4_4_ = pfVar2[1] * 0.33333334;
  auVar102._8_4_ = pfVar2[2] * 0.33333334;
  auVar102._12_4_ = pfVar2[3] * 0.33333334;
  fVar191 = fVar218 + *pfVar3 * 0.33333334;
  fVar287 = fVar240 + pfVar3[1] * 0.33333334;
  fVar288 = fVar168 + pfVar3[2] * 0.33333334;
  fVar289 = fVar186 + pfVar3[3] * 0.33333334;
  auVar7 = vsubps_avx(auVar224,auVar102);
  fVar192 = auVar78._0_4_;
  fVar213 = auVar78._4_4_;
  fVar214 = auVar78._8_4_;
  fVar215 = auVar78._12_4_;
  fVar290 = auVar150._0_4_ * 0.0;
  fVar300 = auVar150._4_4_ * 0.0;
  fVar301 = auVar150._8_4_ * 0.0;
  fVar302 = auVar150._12_4_ * 0.0;
  fVar219 = fVar290 + fVar192 * 0.0;
  fVar234 = fVar300 + fVar213 * 0.0;
  fVar235 = fVar301 + fVar214 * 0.0;
  fVar236 = fVar302 + fVar215 * 0.0;
  fVar303 = fVar187 * 0.0;
  fVar307 = fVar188 * 0.0;
  fVar308 = fVar189 * 0.0;
  fVar309 = fVar190 * 0.0;
  local_6c0._0_4_ = fVar216 + fVar303 + fVar219;
  local_6c0._4_4_ = fVar237 + fVar307 + fVar234;
  fStack_6b8 = fVar217 + fVar308 + fVar235;
  fStack_6b4 = fVar239 + fVar309 + fVar236;
  auVar134._0_4_ = fVar187 * 3.0 + fVar219;
  auVar134._4_4_ = fVar188 * 3.0 + fVar234;
  auVar134._8_4_ = fVar189 * 3.0 + fVar235;
  auVar134._12_4_ = fVar190 * 3.0 + fVar236;
  auVar255._0_4_ = fVar216 * 3.0;
  auVar255._4_4_ = fVar237 * 3.0;
  auVar255._8_4_ = fVar217 * 3.0;
  auVar255._12_4_ = fVar239 * 3.0;
  auVar238 = vsubps_avx(auVar134,auVar255);
  fVar219 = auVar224._0_4_;
  fVar234 = auVar224._4_4_;
  fVar235 = auVar224._8_4_;
  fVar236 = auVar224._12_4_;
  fVar314 = auVar7._0_4_ * 0.0;
  fVar320 = auVar7._4_4_ * 0.0;
  fVar321 = auVar7._8_4_ * 0.0;
  fVar322 = auVar7._12_4_ * 0.0;
  fVar187 = fVar219 * 0.0 + fVar314;
  fVar188 = fVar234 * 0.0 + fVar320;
  fVar189 = fVar235 * 0.0 + fVar321;
  fVar190 = fVar236 * 0.0 + fVar322;
  fVar324 = fVar191 * 0.0;
  fVar330 = fVar287 * 0.0;
  fVar331 = fVar288 * 0.0;
  fVar332 = fVar289 * 0.0;
  auVar333._0_4_ = fVar324 + fVar187 + fVar218;
  auVar333._4_4_ = fVar330 + fVar188 + fVar240;
  auVar333._8_4_ = fVar331 + fVar189 + fVar168;
  auVar333._12_4_ = fVar332 + fVar190 + fVar186;
  auVar256._0_4_ = fVar191 * 3.0 + fVar187;
  auVar256._4_4_ = fVar287 * 3.0 + fVar188;
  auVar256._8_4_ = fVar288 * 3.0 + fVar189;
  auVar256._12_4_ = fVar289 * 3.0 + fVar190;
  auVar279._0_4_ = fVar218 * 3.0;
  auVar279._4_4_ = fVar240 * 3.0;
  auVar279._8_4_ = fVar168 * 3.0;
  auVar279._12_4_ = fVar186 * 3.0;
  auVar8 = vsubps_avx(auVar256,auVar279);
  auVar291._0_4_ = fVar216 * 0.0;
  auVar291._4_4_ = fVar237 * 0.0;
  auVar291._8_4_ = fVar217 * 0.0;
  auVar291._12_4_ = fVar239 * 0.0;
  auVar159._0_4_ = auVar291._0_4_ + fVar303 + fVar290 + fVar192;
  auVar159._4_4_ = auVar291._4_4_ + fVar307 + fVar300 + fVar213;
  auVar159._8_4_ = auVar291._8_4_ + fVar308 + fVar301 + fVar214;
  auVar159._12_4_ = auVar291._12_4_ + fVar309 + fVar302 + fVar215;
  auVar169._0_4_ = fVar192 * 3.0;
  auVar169._4_4_ = fVar213 * 3.0;
  auVar169._8_4_ = fVar214 * 3.0;
  auVar169._12_4_ = fVar215 * 3.0;
  auVar257._0_4_ = auVar150._0_4_ * 3.0;
  auVar257._4_4_ = auVar150._4_4_ * 3.0;
  auVar257._8_4_ = auVar150._8_4_ * 3.0;
  auVar257._12_4_ = auVar150._12_4_ * 3.0;
  auVar78 = vsubps_avx(auVar169,auVar257);
  auVar170._0_4_ = fVar303 + auVar78._0_4_;
  auVar170._4_4_ = fVar307 + auVar78._4_4_;
  auVar170._8_4_ = fVar308 + auVar78._8_4_;
  auVar170._12_4_ = fVar309 + auVar78._12_4_;
  auVar9 = vsubps_avx(auVar170,auVar291);
  auVar195._0_4_ = fVar218 * 0.0;
  auVar195._4_4_ = fVar240 * 0.0;
  auVar195._8_4_ = fVar168 * 0.0;
  auVar195._12_4_ = fVar186 * 0.0;
  auVar266._0_4_ = fVar324 + fVar314 + fVar219 + auVar195._0_4_;
  auVar266._4_4_ = fVar330 + fVar320 + fVar234 + auVar195._4_4_;
  auVar266._8_4_ = fVar331 + fVar321 + fVar235 + auVar195._8_4_;
  auVar266._12_4_ = fVar332 + fVar322 + fVar236 + auVar195._12_4_;
  auVar221._0_4_ = fVar219 * 3.0;
  auVar221._4_4_ = fVar234 * 3.0;
  auVar221._8_4_ = fVar235 * 3.0;
  auVar221._12_4_ = fVar236 * 3.0;
  auVar241._0_4_ = auVar7._0_4_ * 3.0;
  auVar241._4_4_ = auVar7._4_4_ * 3.0;
  auVar241._8_4_ = auVar7._8_4_ * 3.0;
  auVar241._12_4_ = auVar7._12_4_ * 3.0;
  auVar78 = vsubps_avx(auVar221,auVar241);
  auVar222._0_4_ = fVar324 + auVar78._0_4_;
  auVar222._4_4_ = fVar330 + auVar78._4_4_;
  auVar222._8_4_ = fVar331 + auVar78._8_4_;
  auVar222._12_4_ = fVar332 + auVar78._12_4_;
  auVar118 = vsubps_avx(auVar222,auVar195);
  auVar78 = vshufps_avx(auVar238,auVar238,0xc9);
  auVar224 = vshufps_avx(auVar333,auVar333,0xc9);
  fVar187 = auVar238._0_4_;
  auVar242._0_4_ = fVar187 * auVar224._0_4_;
  fVar188 = auVar238._4_4_;
  auVar242._4_4_ = fVar188 * auVar224._4_4_;
  fVar189 = auVar238._8_4_;
  auVar242._8_4_ = fVar189 * auVar224._8_4_;
  fVar190 = auVar238._12_4_;
  auVar242._12_4_ = fVar190 * auVar224._12_4_;
  auVar258._0_4_ = auVar333._0_4_ * auVar78._0_4_;
  auVar258._4_4_ = auVar333._4_4_ * auVar78._4_4_;
  auVar258._8_4_ = auVar333._8_4_ * auVar78._8_4_;
  auVar258._12_4_ = auVar333._12_4_ * auVar78._12_4_;
  auVar224 = vsubps_avx(auVar258,auVar242);
  auVar150 = vshufps_avx(auVar224,auVar224,0xc9);
  auVar224 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar243._0_4_ = fVar187 * auVar224._0_4_;
  auVar243._4_4_ = fVar188 * auVar224._4_4_;
  auVar243._8_4_ = fVar189 * auVar224._8_4_;
  auVar243._12_4_ = fVar190 * auVar224._12_4_;
  auVar196._0_4_ = auVar8._0_4_ * auVar78._0_4_;
  auVar196._4_4_ = auVar8._4_4_ * auVar78._4_4_;
  auVar196._8_4_ = auVar8._8_4_ * auVar78._8_4_;
  auVar196._12_4_ = auVar8._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar196,auVar243);
  auVar7 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar78 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar224 = vshufps_avx(auVar266,auVar266,0xc9);
  fVar191 = auVar9._0_4_;
  auVar197._0_4_ = fVar191 * auVar224._0_4_;
  fVar287 = auVar9._4_4_;
  auVar197._4_4_ = fVar287 * auVar224._4_4_;
  fVar288 = auVar9._8_4_;
  auVar197._8_4_ = fVar288 * auVar224._8_4_;
  fVar289 = auVar9._12_4_;
  auVar197._12_4_ = fVar289 * auVar224._12_4_;
  auVar267._0_4_ = auVar266._0_4_ * auVar78._0_4_;
  auVar267._4_4_ = auVar266._4_4_ * auVar78._4_4_;
  auVar267._8_4_ = auVar266._8_4_ * auVar78._8_4_;
  auVar267._12_4_ = auVar266._12_4_ * auVar78._12_4_;
  auVar224 = vsubps_avx(auVar267,auVar197);
  auVar8 = vshufps_avx(auVar224,auVar224,0xc9);
  auVar224 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar268._0_4_ = auVar224._0_4_ * fVar191;
  auVar268._4_4_ = auVar224._4_4_ * fVar287;
  auVar268._8_4_ = auVar224._8_4_ * fVar288;
  auVar268._12_4_ = auVar224._12_4_ * fVar289;
  auVar223._0_4_ = auVar78._0_4_ * auVar118._0_4_;
  auVar223._4_4_ = auVar78._4_4_ * auVar118._4_4_;
  auVar223._8_4_ = auVar78._8_4_ * auVar118._8_4_;
  auVar223._12_4_ = auVar78._12_4_ * auVar118._12_4_;
  auVar78 = vdpps_avx(auVar150,auVar150,0x7f);
  auVar224 = vsubps_avx(auVar223,auVar268);
  auVar118 = vshufps_avx(auVar224,auVar224,0xc9);
  fVar214 = auVar78._0_4_;
  auVar140 = ZEXT416((uint)fVar214);
  auVar224 = vrsqrtss_avx(auVar140,auVar140);
  fVar192 = auVar224._0_4_;
  auVar224 = ZEXT416((uint)(fVar192 * 1.5 - fVar214 * 0.5 * fVar192 * fVar192 * fVar192));
  auVar107 = vshufps_avx(auVar224,auVar224,0);
  fVar192 = auVar150._0_4_ * auVar107._0_4_;
  fVar219 = auVar150._4_4_ * auVar107._4_4_;
  fVar213 = auVar150._8_4_ * auVar107._8_4_;
  fVar234 = auVar150._12_4_ * auVar107._12_4_;
  auVar224 = vdpps_avx(auVar150,auVar7,0x7f);
  auVar78 = vshufps_avx(auVar78,auVar78,0);
  auVar280._0_4_ = auVar78._0_4_ * auVar7._0_4_;
  auVar280._4_4_ = auVar78._4_4_ * auVar7._4_4_;
  auVar280._8_4_ = auVar78._8_4_ * auVar7._8_4_;
  auVar280._12_4_ = auVar78._12_4_ * auVar7._12_4_;
  auVar78 = vshufps_avx(auVar224,auVar224,0);
  auVar259._0_4_ = auVar78._0_4_ * auVar150._0_4_;
  auVar259._4_4_ = auVar78._4_4_ * auVar150._4_4_;
  auVar259._8_4_ = auVar78._8_4_ * auVar150._8_4_;
  auVar259._12_4_ = auVar78._12_4_ * auVar150._12_4_;
  auVar73 = vsubps_avx(auVar280,auVar259);
  auVar78 = vrcpss_avx(auVar140,auVar140);
  auVar78 = ZEXT416((uint)(auVar78._0_4_ * (2.0 - fVar214 * auVar78._0_4_)));
  auVar7 = vshufps_avx(auVar78,auVar78,0);
  auVar224 = vdpps_avx(auVar8,auVar8,0x7f);
  auVar78 = vblendps_avx(auVar224,_DAT_01f7aa10,0xe);
  auVar150 = vrsqrtss_avx(auVar78,auVar78);
  fVar214 = auVar150._0_4_;
  auVar150 = vdpps_avx(auVar8,auVar118,0x7f);
  auVar140 = ZEXT416((uint)(fVar214 * 1.5 - auVar224._0_4_ * 0.5 * fVar214 * fVar214 * fVar214));
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  fVar214 = auVar140._0_4_ * auVar8._0_4_;
  fVar235 = auVar140._4_4_ * auVar8._4_4_;
  fVar215 = auVar140._8_4_ * auVar8._8_4_;
  fVar236 = auVar140._12_4_ * auVar8._12_4_;
  auVar108 = vshufps_avx(auVar224,auVar224,0);
  auVar244._0_4_ = auVar108._0_4_ * auVar118._0_4_;
  auVar244._4_4_ = auVar108._4_4_ * auVar118._4_4_;
  auVar244._8_4_ = auVar108._8_4_ * auVar118._8_4_;
  auVar244._12_4_ = auVar108._12_4_ * auVar118._12_4_;
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  auVar198._0_4_ = auVar150._0_4_ * auVar8._0_4_;
  auVar198._4_4_ = auVar150._4_4_ * auVar8._4_4_;
  auVar198._8_4_ = auVar150._8_4_ * auVar8._8_4_;
  auVar198._12_4_ = auVar150._12_4_ * auVar8._12_4_;
  auVar8 = vsubps_avx(auVar244,auVar198);
  auVar78 = vrcpss_avx(auVar78,auVar78);
  auVar78 = ZEXT416((uint)((2.0 - auVar224._0_4_ * auVar78._0_4_) * auVar78._0_4_));
  auVar78 = vshufps_avx(auVar78,auVar78,0);
  auVar224 = vshufps_avx(_local_6c0,_local_6c0,0xff);
  auVar269._0_4_ = auVar224._0_4_ * fVar192;
  auVar269._4_4_ = auVar224._4_4_ * fVar219;
  auVar269._8_4_ = auVar224._8_4_ * fVar213;
  auVar269._12_4_ = auVar224._12_4_ * fVar234;
  _local_4e0 = vsubps_avx(_local_6c0,auVar269);
  auVar150 = vshufps_avx(auVar238,auVar238,0xff);
  auVar225._0_4_ =
       auVar150._0_4_ * fVar192 + auVar107._0_4_ * auVar73._0_4_ * auVar7._0_4_ * auVar224._0_4_;
  auVar225._4_4_ =
       auVar150._4_4_ * fVar219 + auVar107._4_4_ * auVar73._4_4_ * auVar7._4_4_ * auVar224._4_4_;
  auVar225._8_4_ =
       auVar150._8_4_ * fVar213 + auVar107._8_4_ * auVar73._8_4_ * auVar7._8_4_ * auVar224._8_4_;
  auVar225._12_4_ =
       auVar150._12_4_ * fVar234 +
       auVar107._12_4_ * auVar73._12_4_ * auVar7._12_4_ * auVar224._12_4_;
  auVar7 = vsubps_avx(auVar238,auVar225);
  local_4f0._0_4_ = auVar269._0_4_ + (float)local_6c0._0_4_;
  local_4f0._4_4_ = auVar269._4_4_ + (float)local_6c0._4_4_;
  fStack_4e8 = auVar269._8_4_ + fStack_6b8;
  fStack_4e4 = auVar269._12_4_ + fStack_6b4;
  auVar224 = vshufps_avx(auVar159,auVar159,0xff);
  auVar135._0_4_ = fVar214 * auVar224._0_4_;
  auVar135._4_4_ = fVar235 * auVar224._4_4_;
  auVar135._8_4_ = fVar215 * auVar224._8_4_;
  auVar135._12_4_ = fVar236 * auVar224._12_4_;
  _local_500 = vsubps_avx(auVar159,auVar135);
  auVar150 = vshufps_avx(auVar9,auVar9,0xff);
  auVar103._0_4_ =
       fVar214 * auVar150._0_4_ + auVar224._0_4_ * auVar140._0_4_ * auVar8._0_4_ * auVar78._0_4_;
  auVar103._4_4_ =
       fVar235 * auVar150._4_4_ + auVar224._4_4_ * auVar140._4_4_ * auVar8._4_4_ * auVar78._4_4_;
  auVar103._8_4_ =
       fVar215 * auVar150._8_4_ + auVar224._8_4_ * auVar140._8_4_ * auVar8._8_4_ * auVar78._8_4_;
  auVar103._12_4_ =
       fVar236 * auVar150._12_4_ +
       auVar224._12_4_ * auVar140._12_4_ * auVar8._12_4_ * auVar78._12_4_;
  auVar8 = vsubps_avx(auVar9,auVar103);
  local_510._0_4_ = auVar159._0_4_ + auVar135._0_4_;
  local_510._4_4_ = auVar159._4_4_ + auVar135._4_4_;
  fStack_508 = auVar159._8_4_ + auVar135._8_4_;
  fStack_504 = auVar159._12_4_ + auVar135._12_4_;
  local_520._0_4_ = local_4e0._0_4_ + auVar7._0_4_ * 0.33333334;
  local_520._4_4_ = local_4e0._4_4_ + auVar7._4_4_ * 0.33333334;
  fStack_518 = local_4e0._8_4_ + auVar7._8_4_ * 0.33333334;
  fStack_514 = local_4e0._12_4_ + auVar7._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx(_local_4e0,auVar6);
  auVar224 = vmovsldup_avx(local_3a0);
  auVar78 = vmovshdup_avx(local_3a0);
  auVar150 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar192 = pre->ray_space[k].vx.field_0.m128[0];
  fVar219 = pre->ray_space[k].vx.field_0.m128[1];
  fVar213 = pre->ray_space[k].vx.field_0.m128[2];
  fVar234 = pre->ray_space[k].vx.field_0.m128[3];
  fVar214 = pre->ray_space[k].vy.field_0.m128[0];
  fVar235 = pre->ray_space[k].vy.field_0.m128[1];
  fVar215 = pre->ray_space[k].vy.field_0.m128[2];
  fVar236 = pre->ray_space[k].vy.field_0.m128[3];
  fVar216 = pre->ray_space[k].vz.field_0.m128[0];
  fVar237 = pre->ray_space[k].vz.field_0.m128[1];
  fVar217 = pre->ray_space[k].vz.field_0.m128[2];
  fVar239 = pre->ray_space[k].vz.field_0.m128[3];
  fVar218 = fVar192 * auVar224._0_4_ + auVar150._0_4_ * fVar216 + fVar214 * auVar78._0_4_;
  fVar168 = fVar219 * auVar224._4_4_ + auVar150._4_4_ * fVar237 + fVar235 * auVar78._4_4_;
  local_6c0._4_4_ = fVar168;
  local_6c0._0_4_ = fVar218;
  fStack_6b8 = fVar213 * auVar224._8_4_ + auVar150._8_4_ * fVar217 + fVar215 * auVar78._8_4_;
  fStack_6b4 = fVar234 * auVar224._12_4_ + auVar150._12_4_ * fVar239 + fVar236 * auVar78._12_4_;
  local_3b0 = vsubps_avx(_local_520,auVar6);
  auVar150 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar78 = vmovshdup_avx(local_3b0);
  auVar224 = vmovsldup_avx(local_3b0);
  fVar240 = auVar224._0_4_ * fVar192 + auVar78._0_4_ * fVar214 + fVar216 * auVar150._0_4_;
  fVar186 = auVar224._4_4_ * fVar219 + auVar78._4_4_ * fVar235 + fVar237 * auVar150._4_4_;
  local_660._4_4_ = fVar186;
  local_660._0_4_ = fVar240;
  fStack_658 = auVar224._8_4_ * fVar213 + auVar78._8_4_ * fVar215 + fVar217 * auVar150._8_4_;
  fStack_654 = auVar224._12_4_ * fVar234 + auVar78._12_4_ * fVar236 + fVar239 * auVar150._12_4_;
  auVar199._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar8._12_4_ * 0.33333334;
  _local_530 = vsubps_avx(_local_500,auVar199);
  local_3c0 = vsubps_avx(_local_530,auVar6);
  auVar150 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar78 = vmovshdup_avx(local_3c0);
  auVar224 = vmovsldup_avx(local_3c0);
  auVar304._0_4_ = auVar224._0_4_ * fVar192 + auVar78._0_4_ * fVar214 + fVar216 * auVar150._0_4_;
  auVar304._4_4_ = auVar224._4_4_ * fVar219 + auVar78._4_4_ * fVar235 + fVar237 * auVar150._4_4_;
  auVar304._8_4_ = auVar224._8_4_ * fVar213 + auVar78._8_4_ * fVar215 + fVar217 * auVar150._8_4_;
  auVar304._12_4_ = auVar224._12_4_ * fVar234 + auVar78._12_4_ * fVar236 + fVar239 * auVar150._12_4_
  ;
  local_3d0 = vsubps_avx(_local_500,auVar6);
  auVar150 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar78 = vmovshdup_avx(local_3d0);
  auVar224 = vmovsldup_avx(local_3d0);
  auVar315._0_4_ = auVar224._0_4_ * fVar192 + auVar78._0_4_ * fVar214 + auVar150._0_4_ * fVar216;
  auVar315._4_4_ = auVar224._4_4_ * fVar219 + auVar78._4_4_ * fVar235 + auVar150._4_4_ * fVar237;
  auVar315._8_4_ = auVar224._8_4_ * fVar213 + auVar78._8_4_ * fVar215 + auVar150._8_4_ * fVar217;
  auVar315._12_4_ = auVar224._12_4_ * fVar234 + auVar78._12_4_ * fVar236 + auVar150._12_4_ * fVar239
  ;
  local_3e0 = vsubps_avx(_local_4f0,auVar6);
  auVar150 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar78 = vmovshdup_avx(local_3e0);
  auVar224 = vmovsldup_avx(local_3e0);
  auVar281._0_4_ = auVar224._0_4_ * fVar192 + auVar78._0_4_ * fVar214 + auVar150._0_4_ * fVar216;
  auVar281._4_4_ = auVar224._4_4_ * fVar219 + auVar78._4_4_ * fVar235 + auVar150._4_4_ * fVar237;
  auVar281._8_4_ = auVar224._8_4_ * fVar213 + auVar78._8_4_ * fVar215 + auVar150._8_4_ * fVar217;
  auVar281._12_4_ = auVar224._12_4_ * fVar234 + auVar78._12_4_ * fVar236 + auVar150._12_4_ * fVar239
  ;
  local_540._0_4_ = (float)local_4f0._0_4_ + (fVar187 + auVar225._0_4_) * 0.33333334;
  local_540._4_4_ = (float)local_4f0._4_4_ + (fVar188 + auVar225._4_4_) * 0.33333334;
  fStack_538 = fStack_4e8 + (fVar189 + auVar225._8_4_) * 0.33333334;
  fStack_534 = fStack_4e4 + (fVar190 + auVar225._12_4_) * 0.33333334;
  local_3f0 = vsubps_avx(_local_540,auVar6);
  auVar150 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar78 = vmovshdup_avx(local_3f0);
  auVar224 = vmovsldup_avx(local_3f0);
  auVar260._0_4_ = auVar224._0_4_ * fVar192 + auVar78._0_4_ * fVar214 + auVar150._0_4_ * fVar216;
  auVar260._4_4_ = auVar224._4_4_ * fVar219 + auVar78._4_4_ * fVar235 + auVar150._4_4_ * fVar237;
  auVar260._8_4_ = auVar224._8_4_ * fVar213 + auVar78._8_4_ * fVar215 + auVar150._8_4_ * fVar217;
  auVar260._12_4_ = auVar224._12_4_ * fVar234 + auVar78._12_4_ * fVar236 + auVar150._12_4_ * fVar239
  ;
  auVar245._0_4_ = (fVar191 + auVar103._0_4_) * 0.33333334;
  auVar245._4_4_ = (fVar287 + auVar103._4_4_) * 0.33333334;
  auVar245._8_4_ = (fVar288 + auVar103._8_4_) * 0.33333334;
  auVar245._12_4_ = (fVar289 + auVar103._12_4_) * 0.33333334;
  _local_430 = vsubps_avx(_local_510,auVar245);
  local_400 = vsubps_avx(_local_430,auVar6);
  auVar150 = vshufps_avx(local_400,local_400,0xaa);
  auVar78 = vmovshdup_avx(local_400);
  auVar224 = vmovsldup_avx(local_400);
  auVar270._0_4_ = auVar224._0_4_ * fVar192 + auVar78._0_4_ * fVar214 + fVar216 * auVar150._0_4_;
  auVar270._4_4_ = auVar224._4_4_ * fVar219 + auVar78._4_4_ * fVar235 + fVar237 * auVar150._4_4_;
  auVar270._8_4_ = auVar224._8_4_ * fVar213 + auVar78._8_4_ * fVar215 + fVar217 * auVar150._8_4_;
  auVar270._12_4_ = auVar224._12_4_ * fVar234 + auVar78._12_4_ * fVar236 + fVar239 * auVar150._12_4_
  ;
  local_410 = vsubps_avx(_local_510,auVar6);
  auVar150 = vshufps_avx(local_410,local_410,0xaa);
  auVar78 = vmovshdup_avx(local_410);
  auVar224 = vmovsldup_avx(local_410);
  auVar104._0_4_ = fVar192 * auVar224._0_4_ + fVar214 * auVar78._0_4_ + fVar216 * auVar150._0_4_;
  auVar104._4_4_ = fVar219 * auVar224._4_4_ + fVar235 * auVar78._4_4_ + fVar237 * auVar150._4_4_;
  auVar104._8_4_ = fVar213 * auVar224._8_4_ + fVar215 * auVar78._8_4_ + fVar217 * auVar150._8_4_;
  auVar104._12_4_ = fVar234 * auVar224._12_4_ + fVar236 * auVar78._12_4_ + fVar239 * auVar150._12_4_
  ;
  auVar6 = vmovlhps_avx(_local_6c0,auVar281);
  auVar7 = vmovlhps_avx(_local_660,auVar260);
  auVar8 = vmovlhps_avx(auVar304,auVar270);
  _local_4c0 = vmovlhps_avx(auVar315,auVar104);
  auVar78 = vminps_avx(auVar6,auVar7);
  auVar224 = vminps_avx(auVar8,_local_4c0);
  auVar150 = vminps_avx(auVar78,auVar224);
  auVar78 = vmaxps_avx(auVar6,auVar7);
  auVar224 = vmaxps_avx(auVar8,_local_4c0);
  auVar78 = vmaxps_avx(auVar78,auVar224);
  auVar224 = vshufpd_avx(auVar150,auVar150,3);
  auVar150 = vminps_avx(auVar150,auVar224);
  auVar224 = vshufpd_avx(auVar78,auVar78,3);
  auVar224 = vmaxps_avx(auVar78,auVar224);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar78 = vandps_avx(auVar150,auVar226);
  auVar224 = vandps_avx(auVar224,auVar226);
  auVar78 = vmaxps_avx(auVar78,auVar224);
  auVar224 = vmovshdup_avx(auVar78);
  auVar78 = vmaxss_avx(auVar224,auVar78);
  fVar192 = auVar78._0_4_ * 9.536743e-07;
  local_4d0 = ZEXT416((uint)fVar192);
  auVar78 = vshufps_avx(local_4d0,ZEXT416((uint)fVar192),0);
  local_1c0._16_16_ = auVar78;
  local_1c0._0_16_ = auVar78;
  auVar74._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
  auVar74._8_4_ = auVar78._8_4_ ^ 0x80000000;
  auVar74._12_4_ = auVar78._12_4_ ^ 0x80000000;
  local_360._16_16_ = auVar74;
  local_360._0_16_ = auVar74;
  auVar78 = vpshufd_avx(ZEXT416(uVar67),0);
  local_300._16_16_ = auVar78;
  local_300._0_16_ = auVar78;
  auVar78 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar71 * 4 + 6)),0);
  local_320._16_16_ = auVar78;
  local_320._0_16_ = auVar78;
  bVar63 = false;
  uVar72 = 0;
  fVar192 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar7,auVar6);
  _local_380 = vsubps_avx(auVar8,auVar7);
  _local_390 = vsubps_avx(_local_4c0,auVar8);
  _local_440 = vsubps_avx(_local_4f0,_local_4e0);
  _local_450 = vsubps_avx(_local_540,_local_520);
  _local_460 = vsubps_avx(_local_430,_local_530);
  _local_470 = vsubps_avx(_local_510,_local_500);
  auVar212 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar299 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0106bae0:
  do {
    local_420 = auVar299._0_16_;
    auVar100 = auVar212._0_16_;
    auVar78 = vshufps_avx(auVar100,auVar100,0x50);
    auVar325._8_4_ = 0x3f800000;
    auVar325._0_8_ = 0x3f8000003f800000;
    auVar325._12_4_ = 0x3f800000;
    auVar329._16_4_ = 0x3f800000;
    auVar329._0_16_ = auVar325;
    auVar329._20_4_ = 0x3f800000;
    auVar329._24_4_ = 0x3f800000;
    auVar329._28_4_ = 0x3f800000;
    auVar224 = vsubps_avx(auVar325,auVar78);
    fVar219 = auVar78._0_4_;
    fVar213 = auVar78._4_4_;
    fVar234 = auVar78._8_4_;
    fVar214 = auVar78._12_4_;
    fVar235 = auVar224._0_4_;
    fVar215 = auVar224._4_4_;
    fVar236 = auVar224._8_4_;
    fVar216 = auVar224._12_4_;
    auVar160._0_4_ = auVar281._0_4_ * fVar219 + fVar235 * fVar218;
    auVar160._4_4_ = auVar281._4_4_ * fVar213 + fVar215 * fVar168;
    auVar160._8_4_ = auVar281._0_4_ * fVar234 + fVar236 * fVar218;
    auVar160._12_4_ = auVar281._4_4_ * fVar214 + fVar216 * fVar168;
    auVar136._0_4_ = auVar260._0_4_ * fVar219 + fVar240 * fVar235;
    auVar136._4_4_ = auVar260._4_4_ * fVar213 + fVar186 * fVar215;
    auVar136._8_4_ = auVar260._0_4_ * fVar234 + fVar240 * fVar236;
    auVar136._12_4_ = auVar260._4_4_ * fVar214 + fVar186 * fVar216;
    auVar246._0_4_ = auVar270._0_4_ * fVar219 + auVar304._0_4_ * fVar235;
    auVar246._4_4_ = auVar270._4_4_ * fVar213 + auVar304._4_4_ * fVar215;
    auVar246._8_4_ = auVar270._0_4_ * fVar234 + auVar304._0_4_ * fVar236;
    auVar246._12_4_ = auVar270._4_4_ * fVar214 + auVar304._4_4_ * fVar216;
    auVar171._0_4_ = auVar104._0_4_ * fVar219 + auVar315._0_4_ * fVar235;
    auVar171._4_4_ = auVar104._4_4_ * fVar213 + auVar315._4_4_ * fVar215;
    auVar171._8_4_ = auVar104._0_4_ * fVar234 + auVar315._0_4_ * fVar236;
    auVar171._12_4_ = auVar104._4_4_ * fVar214 + auVar315._4_4_ * fVar216;
    auVar78 = vmovshdup_avx(local_420);
    auVar224 = vshufps_avx(local_420,local_420,0);
    auVar277._16_16_ = auVar224;
    auVar277._0_16_ = auVar224;
    auVar150 = vshufps_avx(local_420,local_420,0x55);
    auVar93._16_16_ = auVar150;
    auVar93._0_16_ = auVar150;
    auVar89 = vsubps_avx(auVar93,auVar277);
    auVar150 = vshufps_avx(auVar160,auVar160,0);
    auVar118 = vshufps_avx(auVar160,auVar160,0x55);
    auVar107 = vshufps_avx(auVar136,auVar136,0);
    auVar140 = vshufps_avx(auVar136,auVar136,0x55);
    auVar108 = vshufps_avx(auVar246,auVar246,0);
    auVar238 = vshufps_avx(auVar246,auVar246,0x55);
    auVar9 = vshufps_avx(auVar171,auVar171,0);
    auVar73 = vshufps_avx(auVar171,auVar171,0x55);
    auVar78 = ZEXT416((uint)((auVar78._0_4_ - auVar299._0_4_) * 0.04761905));
    auVar78 = vshufps_avx(auVar78,auVar78,0);
    auVar286._0_4_ = auVar224._0_4_ + auVar89._0_4_ * 0.0;
    auVar286._4_4_ = auVar224._4_4_ + auVar89._4_4_ * 0.14285715;
    auVar286._8_4_ = auVar224._8_4_ + auVar89._8_4_ * 0.2857143;
    auVar286._12_4_ = auVar224._12_4_ + auVar89._12_4_ * 0.42857146;
    auVar286._16_4_ = auVar224._0_4_ + auVar89._16_4_ * 0.5714286;
    auVar286._20_4_ = auVar224._4_4_ + auVar89._20_4_ * 0.71428573;
    auVar286._24_4_ = auVar224._8_4_ + auVar89._24_4_ * 0.8571429;
    auVar286._28_4_ = auVar224._12_4_ + auVar89._28_4_;
    auVar17 = vsubps_avx(auVar329,auVar286);
    fVar219 = auVar107._0_4_;
    fVar234 = auVar107._4_4_;
    fVar235 = auVar107._8_4_;
    fVar236 = auVar107._12_4_;
    fVar320 = auVar17._0_4_;
    fVar321 = auVar17._4_4_;
    fVar322 = auVar17._8_4_;
    fVar324 = auVar17._12_4_;
    fVar330 = auVar17._16_4_;
    fVar331 = auVar17._20_4_;
    fVar332 = auVar17._24_4_;
    fVar300 = auVar140._0_4_;
    fVar302 = auVar140._4_4_;
    fVar307 = auVar140._8_4_;
    fVar309 = auVar140._12_4_;
    fVar323 = auVar118._12_4_ + 1.0;
    fVar287 = auVar108._0_4_;
    fVar288 = auVar108._4_4_;
    fVar289 = auVar108._8_4_;
    fVar290 = auVar108._12_4_;
    fVar237 = fVar287 * auVar286._0_4_ + fVar320 * fVar219;
    fVar217 = fVar288 * auVar286._4_4_ + fVar321 * fVar234;
    fVar239 = fVar289 * auVar286._8_4_ + fVar322 * fVar235;
    fVar187 = fVar290 * auVar286._12_4_ + fVar324 * fVar236;
    fVar188 = fVar287 * auVar286._16_4_ + fVar330 * fVar219;
    fVar189 = fVar288 * auVar286._20_4_ + fVar331 * fVar234;
    fVar190 = fVar289 * auVar286._24_4_ + fVar332 * fVar235;
    fVar213 = auVar238._0_4_;
    fVar214 = auVar238._4_4_;
    fVar215 = auVar238._8_4_;
    fVar216 = auVar238._12_4_;
    fVar301 = fVar300 * fVar320 + auVar286._0_4_ * fVar213;
    fVar303 = fVar302 * fVar321 + auVar286._4_4_ * fVar214;
    fVar308 = fVar307 * fVar322 + auVar286._8_4_ * fVar215;
    fVar314 = fVar309 * fVar324 + auVar286._12_4_ * fVar216;
    fVar310 = fVar300 * fVar330 + auVar286._16_4_ * fVar213;
    fVar311 = fVar302 * fVar331 + auVar286._20_4_ * fVar214;
    fVar312 = fVar307 * fVar332 + auVar286._24_4_ * fVar215;
    fVar313 = fVar309 + fVar236;
    auVar224 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar107 = vshufps_avx(auVar160,auVar160,0xff);
    fVar191 = fVar290 + 0.0;
    auVar140 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar108 = vshufps_avx(auVar136,auVar136,0xff);
    auVar184._0_4_ =
         fVar320 * (auVar286._0_4_ * fVar219 + fVar320 * auVar150._0_4_) + auVar286._0_4_ * fVar237;
    auVar184._4_4_ =
         fVar321 * (auVar286._4_4_ * fVar234 + fVar321 * auVar150._4_4_) + auVar286._4_4_ * fVar217;
    auVar184._8_4_ =
         fVar322 * (auVar286._8_4_ * fVar235 + fVar322 * auVar150._8_4_) + auVar286._8_4_ * fVar239;
    auVar184._12_4_ =
         fVar324 * (auVar286._12_4_ * fVar236 + fVar324 * auVar150._12_4_) +
         auVar286._12_4_ * fVar187;
    auVar184._16_4_ =
         fVar330 * (auVar286._16_4_ * fVar219 + fVar330 * auVar150._0_4_) +
         auVar286._16_4_ * fVar188;
    auVar184._20_4_ =
         fVar331 * (auVar286._20_4_ * fVar234 + fVar331 * auVar150._4_4_) +
         auVar286._20_4_ * fVar189;
    auVar184._24_4_ =
         fVar332 * (auVar286._24_4_ * fVar235 + fVar332 * auVar150._8_4_) +
         auVar286._24_4_ * fVar190;
    auVar184._28_4_ = auVar150._12_4_ + 1.0 + fVar216;
    auVar210._0_4_ =
         fVar320 * (fVar300 * auVar286._0_4_ + auVar118._0_4_ * fVar320) + auVar286._0_4_ * fVar301;
    auVar210._4_4_ =
         fVar321 * (fVar302 * auVar286._4_4_ + auVar118._4_4_ * fVar321) + auVar286._4_4_ * fVar303;
    auVar210._8_4_ =
         fVar322 * (fVar307 * auVar286._8_4_ + auVar118._8_4_ * fVar322) + auVar286._8_4_ * fVar308;
    auVar210._12_4_ =
         fVar324 * (fVar309 * auVar286._12_4_ + auVar118._12_4_ * fVar324) +
         auVar286._12_4_ * fVar314;
    auVar210._16_4_ =
         fVar330 * (fVar300 * auVar286._16_4_ + auVar118._0_4_ * fVar330) +
         auVar286._16_4_ * fVar310;
    auVar210._20_4_ =
         fVar331 * (fVar302 * auVar286._20_4_ + auVar118._4_4_ * fVar331) +
         auVar286._20_4_ * fVar311;
    auVar210._24_4_ =
         fVar332 * (fVar307 * auVar286._24_4_ + auVar118._8_4_ * fVar332) +
         auVar286._24_4_ * fVar312;
    auVar210._28_4_ = auVar73._12_4_ + fVar216;
    auVar94._0_4_ =
         fVar320 * fVar237 + auVar286._0_4_ * (fVar287 * fVar320 + auVar9._0_4_ * auVar286._0_4_);
    auVar94._4_4_ =
         fVar321 * fVar217 + auVar286._4_4_ * (fVar288 * fVar321 + auVar9._4_4_ * auVar286._4_4_);
    auVar94._8_4_ =
         fVar322 * fVar239 + auVar286._8_4_ * (fVar289 * fVar322 + auVar9._8_4_ * auVar286._8_4_);
    auVar94._12_4_ =
         fVar324 * fVar187 + auVar286._12_4_ * (fVar290 * fVar324 + auVar9._12_4_ * auVar286._12_4_)
    ;
    auVar94._16_4_ =
         fVar330 * fVar188 + auVar286._16_4_ * (fVar287 * fVar330 + auVar9._0_4_ * auVar286._16_4_);
    auVar94._20_4_ =
         fVar331 * fVar189 + auVar286._20_4_ * (fVar288 * fVar331 + auVar9._4_4_ * auVar286._20_4_);
    auVar94._24_4_ =
         fVar332 * fVar190 + auVar286._24_4_ * (fVar289 * fVar332 + auVar9._8_4_ * auVar286._24_4_);
    auVar94._28_4_ = fVar236 + 1.0 + fVar191;
    auVar298._0_4_ =
         fVar320 * fVar301 + auVar286._0_4_ * (auVar73._0_4_ * auVar286._0_4_ + fVar320 * fVar213);
    auVar298._4_4_ =
         fVar321 * fVar303 + auVar286._4_4_ * (auVar73._4_4_ * auVar286._4_4_ + fVar321 * fVar214);
    auVar298._8_4_ =
         fVar322 * fVar308 + auVar286._8_4_ * (auVar73._8_4_ * auVar286._8_4_ + fVar322 * fVar215);
    auVar298._12_4_ =
         fVar324 * fVar314 +
         auVar286._12_4_ * (auVar73._12_4_ * auVar286._12_4_ + fVar324 * fVar216);
    auVar298._16_4_ =
         fVar330 * fVar310 + auVar286._16_4_ * (auVar73._0_4_ * auVar286._16_4_ + fVar330 * fVar213)
    ;
    auVar298._20_4_ =
         fVar331 * fVar311 + auVar286._20_4_ * (auVar73._4_4_ * auVar286._20_4_ + fVar331 * fVar214)
    ;
    auVar298._24_4_ =
         fVar332 * fVar312 + auVar286._24_4_ * (auVar73._8_4_ * auVar286._24_4_ + fVar332 * fVar215)
    ;
    auVar298._28_4_ = fVar191 + fVar216 + 0.0;
    local_200._0_4_ = fVar320 * auVar184._0_4_ + auVar286._0_4_ * auVar94._0_4_;
    local_200._4_4_ = fVar321 * auVar184._4_4_ + auVar286._4_4_ * auVar94._4_4_;
    local_200._8_4_ = fVar322 * auVar184._8_4_ + auVar286._8_4_ * auVar94._8_4_;
    local_200._12_4_ = fVar324 * auVar184._12_4_ + auVar286._12_4_ * auVar94._12_4_;
    local_200._16_4_ = fVar330 * auVar184._16_4_ + auVar286._16_4_ * auVar94._16_4_;
    local_200._20_4_ = fVar331 * auVar184._20_4_ + auVar286._20_4_ * auVar94._20_4_;
    local_200._24_4_ = fVar332 * auVar184._24_4_ + auVar286._24_4_ * auVar94._24_4_;
    local_200._28_4_ = fVar313 + fVar216 + 0.0;
    auVar167._0_4_ = fVar320 * auVar210._0_4_ + auVar286._0_4_ * auVar298._0_4_;
    auVar167._4_4_ = fVar321 * auVar210._4_4_ + auVar286._4_4_ * auVar298._4_4_;
    auVar167._8_4_ = fVar322 * auVar210._8_4_ + auVar286._8_4_ * auVar298._8_4_;
    auVar167._12_4_ = fVar324 * auVar210._12_4_ + auVar286._12_4_ * auVar298._12_4_;
    auVar167._16_4_ = fVar330 * auVar210._16_4_ + auVar286._16_4_ * auVar298._16_4_;
    auVar167._20_4_ = fVar331 * auVar210._20_4_ + auVar286._20_4_ * auVar298._20_4_;
    auVar167._24_4_ = fVar332 * auVar210._24_4_ + auVar286._24_4_ * auVar298._24_4_;
    auVar167._28_4_ = fVar313 + fVar191;
    auVar18 = vsubps_avx(auVar94,auVar184);
    auVar89 = vsubps_avx(auVar298,auVar210);
    local_620 = auVar78._0_4_;
    fStack_61c = auVar78._4_4_;
    fStack_618 = auVar78._8_4_;
    fStack_614 = auVar78._12_4_;
    local_240 = local_620 * auVar18._0_4_ * 3.0;
    fStack_23c = fStack_61c * auVar18._4_4_ * 3.0;
    auVar25._4_4_ = fStack_23c;
    auVar25._0_4_ = local_240;
    fStack_238 = fStack_618 * auVar18._8_4_ * 3.0;
    auVar25._8_4_ = fStack_238;
    fStack_234 = fStack_614 * auVar18._12_4_ * 3.0;
    auVar25._12_4_ = fStack_234;
    fStack_230 = local_620 * auVar18._16_4_ * 3.0;
    auVar25._16_4_ = fStack_230;
    fStack_22c = fStack_61c * auVar18._20_4_ * 3.0;
    auVar25._20_4_ = fStack_22c;
    fStack_228 = fStack_618 * auVar18._24_4_ * 3.0;
    auVar25._24_4_ = fStack_228;
    auVar25._28_4_ = auVar18._28_4_;
    local_260 = local_620 * auVar89._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar89._4_4_ * 3.0;
    auVar26._4_4_ = fStack_25c;
    auVar26._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar89._8_4_ * 3.0;
    auVar26._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar89._12_4_ * 3.0;
    auVar26._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar89._16_4_ * 3.0;
    auVar26._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar89._20_4_ * 3.0;
    auVar26._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar89._24_4_ * 3.0;
    auVar26._24_4_ = fStack_248;
    auVar26._28_4_ = fVar313;
    auVar15 = vsubps_avx(local_200,auVar25);
    auVar89 = vperm2f128_avx(auVar15,auVar15,1);
    auVar89 = vshufps_avx(auVar89,auVar15,0x30);
    auVar89 = vshufps_avx(auVar15,auVar89,0x29);
    auVar16 = vsubps_avx(auVar167,auVar26);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar16 = vshufps_avx(auVar16,auVar15,0x29);
    fVar311 = auVar140._0_4_;
    fVar312 = auVar140._4_4_;
    fVar334 = auVar140._8_4_;
    fVar236 = auVar224._12_4_;
    fVar288 = auVar108._0_4_;
    fVar290 = auVar108._4_4_;
    fVar301 = auVar108._8_4_;
    fVar303 = auVar108._12_4_;
    auVar78 = vshufps_avx(auVar246,auVar246,0xaa);
    fVar219 = auVar78._0_4_;
    fVar234 = auVar78._4_4_;
    fVar235 = auVar78._8_4_;
    fVar216 = auVar78._12_4_;
    fVar239 = auVar286._0_4_ * fVar219 + fVar311 * fVar320;
    fVar187 = auVar286._4_4_ * fVar234 + fVar312 * fVar321;
    fVar188 = auVar286._8_4_ * fVar235 + fVar334 * fVar322;
    fVar189 = auVar286._12_4_ * fVar216 + auVar140._12_4_ * fVar324;
    fVar190 = auVar286._16_4_ * fVar219 + fVar311 * fVar330;
    fVar191 = auVar286._20_4_ * fVar234 + fVar312 * fVar331;
    fVar287 = auVar286._24_4_ * fVar235 + fVar334 * fVar332;
    auVar78 = vshufps_avx(auVar246,auVar246,0xff);
    fVar213 = auVar78._0_4_;
    fVar214 = auVar78._4_4_;
    fVar215 = auVar78._8_4_;
    fVar237 = auVar78._12_4_;
    fVar289 = auVar286._0_4_ * fVar213 + fVar288 * fVar320;
    fVar300 = auVar286._4_4_ * fVar214 + fVar290 * fVar321;
    fVar302 = auVar286._8_4_ * fVar215 + fVar301 * fVar322;
    fVar307 = auVar286._12_4_ * fVar237 + fVar303 * fVar324;
    fVar308 = auVar286._16_4_ * fVar213 + fVar288 * fVar330;
    fVar309 = auVar286._20_4_ * fVar214 + fVar290 * fVar331;
    fVar314 = auVar286._24_4_ * fVar215 + fVar301 * fVar332;
    auVar78 = vshufps_avx(auVar171,auVar171,0xaa);
    fVar310 = auVar78._12_4_ + fVar216;
    auVar150 = vshufps_avx(auVar171,auVar171,0xff);
    fVar217 = auVar150._12_4_;
    auVar95._0_4_ =
         fVar320 * (fVar311 * auVar286._0_4_ + fVar320 * auVar224._0_4_) + auVar286._0_4_ * fVar239;
    auVar95._4_4_ =
         fVar321 * (fVar312 * auVar286._4_4_ + fVar321 * auVar224._4_4_) + auVar286._4_4_ * fVar187;
    auVar95._8_4_ =
         fVar322 * (fVar334 * auVar286._8_4_ + fVar322 * auVar224._8_4_) + auVar286._8_4_ * fVar188;
    auVar95._12_4_ =
         fVar324 * (auVar140._12_4_ * auVar286._12_4_ + fVar324 * fVar236) +
         auVar286._12_4_ * fVar189;
    auVar95._16_4_ =
         fVar330 * (fVar311 * auVar286._16_4_ + fVar330 * auVar224._0_4_) +
         auVar286._16_4_ * fVar190;
    auVar95._20_4_ =
         fVar331 * (fVar312 * auVar286._20_4_ + fVar331 * auVar224._4_4_) +
         auVar286._20_4_ * fVar191;
    auVar95._24_4_ =
         fVar332 * (fVar334 * auVar286._24_4_ + fVar332 * auVar224._8_4_) +
         auVar286._24_4_ * fVar287;
    auVar95._28_4_ = auVar16._28_4_ + fVar236 + fVar217;
    auVar127._0_4_ =
         fVar320 * (fVar288 * auVar286._0_4_ + auVar107._0_4_ * fVar320) + auVar286._0_4_ * fVar289;
    auVar127._4_4_ =
         fVar321 * (fVar290 * auVar286._4_4_ + auVar107._4_4_ * fVar321) + auVar286._4_4_ * fVar300;
    auVar127._8_4_ =
         fVar322 * (fVar301 * auVar286._8_4_ + auVar107._8_4_ * fVar322) + auVar286._8_4_ * fVar302;
    auVar127._12_4_ =
         fVar324 * (fVar303 * auVar286._12_4_ + auVar107._12_4_ * fVar324) +
         auVar286._12_4_ * fVar307;
    auVar127._16_4_ =
         fVar330 * (fVar288 * auVar286._16_4_ + auVar107._0_4_ * fVar330) +
         auVar286._16_4_ * fVar308;
    auVar127._20_4_ =
         fVar331 * (fVar290 * auVar286._20_4_ + auVar107._4_4_ * fVar331) +
         auVar286._20_4_ * fVar309;
    auVar127._24_4_ =
         fVar332 * (fVar301 * auVar286._24_4_ + auVar107._8_4_ * fVar332) +
         auVar286._24_4_ * fVar314;
    auVar127._28_4_ = fVar236 + auVar15._28_4_ + fVar217;
    auVar15 = vperm2f128_avx(local_200,local_200,1);
    auVar15 = vshufps_avx(auVar15,local_200,0x30);
    auVar19 = vshufps_avx(local_200,auVar15,0x29);
    auVar211._0_4_ =
         auVar286._0_4_ * (auVar78._0_4_ * auVar286._0_4_ + fVar320 * fVar219) + fVar320 * fVar239;
    auVar211._4_4_ =
         auVar286._4_4_ * (auVar78._4_4_ * auVar286._4_4_ + fVar321 * fVar234) + fVar321 * fVar187;
    auVar211._8_4_ =
         auVar286._8_4_ * (auVar78._8_4_ * auVar286._8_4_ + fVar322 * fVar235) + fVar322 * fVar188;
    auVar211._12_4_ =
         auVar286._12_4_ * (auVar78._12_4_ * auVar286._12_4_ + fVar324 * fVar216) +
         fVar324 * fVar189;
    auVar211._16_4_ =
         auVar286._16_4_ * (auVar78._0_4_ * auVar286._16_4_ + fVar330 * fVar219) + fVar330 * fVar190
    ;
    auVar211._20_4_ =
         auVar286._20_4_ * (auVar78._4_4_ * auVar286._20_4_ + fVar331 * fVar234) + fVar331 * fVar191
    ;
    auVar211._24_4_ =
         auVar286._24_4_ * (auVar78._8_4_ * auVar286._24_4_ + fVar332 * fVar235) + fVar332 * fVar287
    ;
    auVar211._28_4_ = fVar310 + fVar323 + auVar210._28_4_;
    auVar265._0_4_ =
         fVar320 * fVar289 + auVar286._0_4_ * (auVar286._0_4_ * auVar150._0_4_ + fVar320 * fVar213);
    auVar265._4_4_ =
         fVar321 * fVar300 + auVar286._4_4_ * (auVar286._4_4_ * auVar150._4_4_ + fVar321 * fVar214);
    auVar265._8_4_ =
         fVar322 * fVar302 + auVar286._8_4_ * (auVar286._8_4_ * auVar150._8_4_ + fVar322 * fVar215);
    auVar265._12_4_ =
         fVar324 * fVar307 + auVar286._12_4_ * (auVar286._12_4_ * fVar217 + fVar324 * fVar237);
    auVar265._16_4_ =
         fVar330 * fVar308 +
         auVar286._16_4_ * (auVar286._16_4_ * auVar150._0_4_ + fVar330 * fVar213);
    auVar265._20_4_ =
         fVar331 * fVar309 +
         auVar286._20_4_ * (auVar286._20_4_ * auVar150._4_4_ + fVar331 * fVar214);
    auVar265._24_4_ =
         fVar332 * fVar314 +
         auVar286._24_4_ * (auVar286._24_4_ * auVar150._8_4_ + fVar332 * fVar215);
    auVar265._28_4_ = fVar323 + fVar303 + fVar217 + fVar237;
    auVar254._0_4_ = fVar320 * auVar95._0_4_ + auVar286._0_4_ * auVar211._0_4_;
    auVar254._4_4_ = fVar321 * auVar95._4_4_ + auVar286._4_4_ * auVar211._4_4_;
    auVar254._8_4_ = fVar322 * auVar95._8_4_ + auVar286._8_4_ * auVar211._8_4_;
    auVar254._12_4_ = fVar324 * auVar95._12_4_ + auVar286._12_4_ * auVar211._12_4_;
    auVar254._16_4_ = fVar330 * auVar95._16_4_ + auVar286._16_4_ * auVar211._16_4_;
    auVar254._20_4_ = fVar331 * auVar95._20_4_ + auVar286._20_4_ * auVar211._20_4_;
    auVar254._24_4_ = fVar332 * auVar95._24_4_ + auVar286._24_4_ * auVar211._24_4_;
    auVar254._28_4_ = fVar310 + fVar217 + fVar237;
    auVar278._0_4_ = fVar320 * auVar127._0_4_ + auVar286._0_4_ * auVar265._0_4_;
    auVar278._4_4_ = fVar321 * auVar127._4_4_ + auVar286._4_4_ * auVar265._4_4_;
    auVar278._8_4_ = fVar322 * auVar127._8_4_ + auVar286._8_4_ * auVar265._8_4_;
    auVar278._12_4_ = fVar324 * auVar127._12_4_ + auVar286._12_4_ * auVar265._12_4_;
    auVar278._16_4_ = fVar330 * auVar127._16_4_ + auVar286._16_4_ * auVar265._16_4_;
    auVar278._20_4_ = fVar331 * auVar127._20_4_ + auVar286._20_4_ * auVar265._20_4_;
    auVar278._24_4_ = fVar332 * auVar127._24_4_ + auVar286._24_4_ * auVar265._24_4_;
    auVar278._28_4_ = auVar17._28_4_ + auVar286._28_4_;
    auVar22 = vsubps_avx(auVar211,auVar95);
    auVar15 = vsubps_avx(auVar265,auVar127);
    local_280 = local_620 * auVar22._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar22._4_4_ * 3.0;
    auVar27._4_4_ = fStack_27c;
    auVar27._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar22._8_4_ * 3.0;
    auVar27._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar22._12_4_ * 3.0;
    auVar27._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar22._16_4_ * 3.0;
    auVar27._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar22._20_4_ * 3.0;
    auVar27._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar22._24_4_ * 3.0;
    auVar27._24_4_ = fStack_268;
    auVar27._28_4_ = auVar22._28_4_;
    local_2a0 = local_620 * auVar15._0_4_ * 3.0;
    fStack_29c = fStack_61c * auVar15._4_4_ * 3.0;
    auVar28._4_4_ = fStack_29c;
    auVar28._0_4_ = local_2a0;
    fStack_298 = fStack_618 * auVar15._8_4_ * 3.0;
    auVar28._8_4_ = fStack_298;
    fStack_294 = fStack_614 * auVar15._12_4_ * 3.0;
    auVar28._12_4_ = fStack_294;
    fStack_290 = local_620 * auVar15._16_4_ * 3.0;
    auVar28._16_4_ = fStack_290;
    fStack_28c = fStack_61c * auVar15._20_4_ * 3.0;
    auVar28._20_4_ = fStack_28c;
    fStack_288 = fStack_618 * auVar15._24_4_ * 3.0;
    auVar28._24_4_ = fStack_288;
    auVar28._28_4_ = auVar211._28_4_;
    auVar15 = vperm2f128_avx(auVar254,auVar254,1);
    auVar15 = vshufps_avx(auVar15,auVar254,0x30);
    auVar20 = vshufps_avx(auVar254,auVar15,0x29);
    auVar17 = vsubps_avx(auVar254,auVar27);
    auVar15 = vperm2f128_avx(auVar17,auVar17,1);
    auVar15 = vshufps_avx(auVar15,auVar17,0x30);
    auVar15 = vshufps_avx(auVar17,auVar15,0x29);
    auVar21 = vsubps_avx(auVar278,auVar28);
    auVar17 = vperm2f128_avx(auVar21,auVar21,1);
    auVar17 = vshufps_avx(auVar17,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar17,0x29);
    auVar23 = vsubps_avx(auVar254,local_200);
    auVar24 = vsubps_avx(auVar20,auVar19);
    fVar219 = auVar24._0_4_ + auVar23._0_4_;
    fVar213 = auVar24._4_4_ + auVar23._4_4_;
    fVar234 = auVar24._8_4_ + auVar23._8_4_;
    fVar214 = auVar24._12_4_ + auVar23._12_4_;
    fVar235 = auVar24._16_4_ + auVar23._16_4_;
    fVar215 = auVar24._20_4_ + auVar23._20_4_;
    fVar236 = auVar24._24_4_ + auVar23._24_4_;
    auVar17 = vperm2f128_avx(auVar167,auVar167,1);
    auVar17 = vshufps_avx(auVar17,auVar167,0x30);
    local_220 = vshufps_avx(auVar167,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar278,auVar278,1);
    auVar17 = vshufps_avx(auVar17,auVar278,0x30);
    local_1e0 = vshufps_avx(auVar278,auVar17,0x29);
    auVar17 = vsubps_avx(auVar278,auVar167);
    auVar90 = vsubps_avx(local_1e0,local_220);
    fVar216 = auVar90._0_4_ + auVar17._0_4_;
    fVar237 = auVar90._4_4_ + auVar17._4_4_;
    fVar217 = auVar90._8_4_ + auVar17._8_4_;
    fVar239 = auVar90._12_4_ + auVar17._12_4_;
    fVar187 = auVar90._16_4_ + auVar17._16_4_;
    fVar188 = auVar90._20_4_ + auVar17._20_4_;
    fVar189 = auVar90._24_4_ + auVar17._24_4_;
    auVar29._4_4_ = fVar213 * auVar167._4_4_;
    auVar29._0_4_ = fVar219 * auVar167._0_4_;
    auVar29._8_4_ = fVar234 * auVar167._8_4_;
    auVar29._12_4_ = fVar214 * auVar167._12_4_;
    auVar29._16_4_ = fVar235 * auVar167._16_4_;
    auVar29._20_4_ = fVar215 * auVar167._20_4_;
    auVar29._24_4_ = fVar236 * auVar167._24_4_;
    auVar29._28_4_ = auVar17._28_4_;
    auVar30._4_4_ = fVar237 * local_200._4_4_;
    auVar30._0_4_ = fVar216 * local_200._0_4_;
    auVar30._8_4_ = fVar217 * local_200._8_4_;
    auVar30._12_4_ = fVar239 * local_200._12_4_;
    auVar30._16_4_ = fVar187 * local_200._16_4_;
    auVar30._20_4_ = fVar188 * local_200._20_4_;
    auVar30._24_4_ = fVar189 * local_200._24_4_;
    auVar30._28_4_ = fVar310;
    auVar91 = vsubps_avx(auVar29,auVar30);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar18._28_4_;
    local_260 = local_260 + auVar167._0_4_;
    fStack_25c = fStack_25c + auVar167._4_4_;
    fStack_258 = fStack_258 + auVar167._8_4_;
    fStack_254 = fStack_254 + auVar167._12_4_;
    fStack_250 = fStack_250 + auVar167._16_4_;
    fStack_24c = fStack_24c + auVar167._20_4_;
    fStack_248 = fStack_248 + auVar167._24_4_;
    fStack_244 = fVar313 + auVar167._28_4_;
    auVar31._4_4_ = fVar213 * fStack_25c;
    auVar31._0_4_ = fVar219 * local_260;
    auVar31._8_4_ = fVar234 * fStack_258;
    auVar31._12_4_ = fVar214 * fStack_254;
    auVar31._16_4_ = fVar235 * fStack_250;
    auVar31._20_4_ = fVar215 * fStack_24c;
    auVar31._24_4_ = fVar236 * fStack_248;
    auVar31._28_4_ = fVar313;
    auVar32._4_4_ = fVar237 * fStack_23c;
    auVar32._0_4_ = fVar216 * local_240;
    auVar32._8_4_ = fVar217 * fStack_238;
    auVar32._12_4_ = fVar239 * fStack_234;
    auVar32._16_4_ = fVar187 * fStack_230;
    auVar32._20_4_ = fVar188 * fStack_22c;
    auVar32._24_4_ = fVar189 * fStack_228;
    auVar32._28_4_ = fVar313 + auVar167._28_4_;
    auVar18 = vsubps_avx(auVar31,auVar32);
    local_660._0_4_ = auVar16._0_4_;
    local_660._4_4_ = auVar16._4_4_;
    fStack_658 = auVar16._8_4_;
    fStack_654 = auVar16._12_4_;
    fStack_650 = auVar16._16_4_;
    fStack_64c = auVar16._20_4_;
    fStack_648 = auVar16._24_4_;
    auVar33._4_4_ = fVar213 * (float)local_660._4_4_;
    auVar33._0_4_ = fVar219 * (float)local_660._0_4_;
    auVar33._8_4_ = fVar234 * fStack_658;
    auVar33._12_4_ = fVar214 * fStack_654;
    auVar33._16_4_ = fVar235 * fStack_650;
    auVar33._20_4_ = fVar215 * fStack_64c;
    auVar33._24_4_ = fVar236 * fStack_648;
    auVar33._28_4_ = fVar313;
    local_6c0._0_4_ = auVar89._0_4_;
    local_6c0._4_4_ = auVar89._4_4_;
    fStack_6b8 = auVar89._8_4_;
    fStack_6b4 = auVar89._12_4_;
    fStack_6b0 = auVar89._16_4_;
    fStack_6ac = auVar89._20_4_;
    fStack_6a8 = auVar89._24_4_;
    auVar34._4_4_ = fVar237 * (float)local_6c0._4_4_;
    auVar34._0_4_ = fVar216 * (float)local_6c0._0_4_;
    auVar34._8_4_ = fVar217 * fStack_6b8;
    auVar34._12_4_ = fVar239 * fStack_6b4;
    auVar34._16_4_ = fVar187 * fStack_6b0;
    auVar34._20_4_ = fVar188 * fStack_6ac;
    auVar34._24_4_ = fVar189 * fStack_6a8;
    auVar34._28_4_ = local_200._28_4_;
    auVar123 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = local_220._4_4_ * fVar213;
    auVar35._0_4_ = local_220._0_4_ * fVar219;
    auVar35._8_4_ = local_220._8_4_ * fVar234;
    auVar35._12_4_ = local_220._12_4_ * fVar214;
    auVar35._16_4_ = local_220._16_4_ * fVar235;
    auVar35._20_4_ = local_220._20_4_ * fVar215;
    auVar35._24_4_ = local_220._24_4_ * fVar236;
    auVar35._28_4_ = fVar313;
    auVar36._4_4_ = auVar19._4_4_ * fVar237;
    auVar36._0_4_ = auVar19._0_4_ * fVar216;
    auVar36._8_4_ = auVar19._8_4_ * fVar217;
    auVar36._12_4_ = auVar19._12_4_ * fVar239;
    auVar36._16_4_ = auVar19._16_4_ * fVar187;
    auVar36._20_4_ = auVar19._20_4_ * fVar188;
    auVar36._24_4_ = auVar19._24_4_ * fVar189;
    auVar36._28_4_ = local_220._28_4_;
    local_620 = auVar15._0_4_;
    fStack_61c = auVar15._4_4_;
    fStack_618 = auVar15._8_4_;
    fStack_614 = auVar15._12_4_;
    fStack_610 = auVar15._16_4_;
    fStack_60c = auVar15._20_4_;
    fStack_608 = auVar15._24_4_;
    auVar124 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar278._4_4_ * fVar213;
    auVar37._0_4_ = auVar278._0_4_ * fVar219;
    auVar37._8_4_ = auVar278._8_4_ * fVar234;
    auVar37._12_4_ = auVar278._12_4_ * fVar214;
    auVar37._16_4_ = auVar278._16_4_ * fVar235;
    auVar37._20_4_ = auVar278._20_4_ * fVar215;
    auVar37._24_4_ = auVar278._24_4_ * fVar236;
    auVar37._28_4_ = fVar313;
    auVar38._4_4_ = fVar237 * auVar254._4_4_;
    auVar38._0_4_ = fVar216 * auVar254._0_4_;
    auVar38._8_4_ = fVar217 * auVar254._8_4_;
    auVar38._12_4_ = fVar239 * auVar254._12_4_;
    auVar38._16_4_ = fVar187 * auVar254._16_4_;
    auVar38._20_4_ = fVar188 * auVar254._20_4_;
    auVar38._24_4_ = fVar189 * auVar254._24_4_;
    auVar38._28_4_ = fStack_224;
    auVar125 = vsubps_avx(auVar37,auVar38);
    local_280 = auVar254._0_4_ + local_280;
    fStack_27c = auVar254._4_4_ + fStack_27c;
    fStack_278 = auVar254._8_4_ + fStack_278;
    fStack_274 = auVar254._12_4_ + fStack_274;
    fStack_270 = auVar254._16_4_ + fStack_270;
    fStack_26c = auVar254._20_4_ + fStack_26c;
    fStack_268 = auVar254._24_4_ + fStack_268;
    fStack_264 = auVar254._28_4_ + auVar22._28_4_;
    local_2a0 = auVar278._0_4_ + local_2a0;
    fStack_29c = auVar278._4_4_ + fStack_29c;
    fStack_298 = auVar278._8_4_ + fStack_298;
    fStack_294 = auVar278._12_4_ + fStack_294;
    fStack_290 = auVar278._16_4_ + fStack_290;
    fStack_28c = auVar278._20_4_ + fStack_28c;
    fStack_288 = auVar278._24_4_ + fStack_288;
    fStack_284 = auVar278._28_4_ + auVar211._28_4_;
    auVar39._4_4_ = fVar213 * fStack_29c;
    auVar39._0_4_ = fVar219 * local_2a0;
    auVar39._8_4_ = fVar234 * fStack_298;
    auVar39._12_4_ = fVar214 * fStack_294;
    auVar39._16_4_ = fVar235 * fStack_290;
    auVar39._20_4_ = fVar215 * fStack_28c;
    auVar39._24_4_ = fVar236 * fStack_288;
    auVar39._28_4_ = auVar278._28_4_ + auVar211._28_4_;
    auVar40._4_4_ = fStack_27c * fVar237;
    auVar40._0_4_ = local_280 * fVar216;
    auVar40._8_4_ = fStack_278 * fVar217;
    auVar40._12_4_ = fStack_274 * fVar239;
    auVar40._16_4_ = fStack_270 * fVar187;
    auVar40._20_4_ = fStack_26c * fVar188;
    auVar40._24_4_ = fStack_268 * fVar189;
    auVar40._28_4_ = fStack_264;
    auVar22 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar213 * auVar21._4_4_;
    auVar41._0_4_ = fVar219 * auVar21._0_4_;
    auVar41._8_4_ = fVar234 * auVar21._8_4_;
    auVar41._12_4_ = fVar214 * auVar21._12_4_;
    auVar41._16_4_ = fVar235 * auVar21._16_4_;
    auVar41._20_4_ = fVar215 * auVar21._20_4_;
    auVar41._24_4_ = fVar236 * auVar21._24_4_;
    auVar41._28_4_ = fStack_264;
    auVar42._4_4_ = fVar237 * fStack_61c;
    auVar42._0_4_ = fVar216 * local_620;
    auVar42._8_4_ = fVar217 * fStack_618;
    auVar42._12_4_ = fVar239 * fStack_614;
    auVar42._16_4_ = fVar187 * fStack_610;
    auVar42._20_4_ = fVar188 * fStack_60c;
    auVar42._24_4_ = fVar189 * fStack_608;
    auVar42._28_4_ = auVar21._28_4_;
    auVar126 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = fVar213 * local_1e0._4_4_;
    auVar43._0_4_ = fVar219 * local_1e0._0_4_;
    auVar43._8_4_ = fVar234 * local_1e0._8_4_;
    auVar43._12_4_ = fVar214 * local_1e0._12_4_;
    auVar43._16_4_ = fVar235 * local_1e0._16_4_;
    auVar43._20_4_ = fVar215 * local_1e0._20_4_;
    auVar43._24_4_ = fVar236 * local_1e0._24_4_;
    auVar43._28_4_ = auVar24._28_4_ + auVar23._28_4_;
    auVar44._4_4_ = auVar20._4_4_ * fVar237;
    auVar44._0_4_ = auVar20._0_4_ * fVar216;
    auVar44._8_4_ = auVar20._8_4_ * fVar217;
    auVar44._12_4_ = auVar20._12_4_ * fVar239;
    auVar44._16_4_ = auVar20._16_4_ * fVar187;
    auVar44._20_4_ = auVar20._20_4_ * fVar188;
    auVar44._24_4_ = auVar20._24_4_ * fVar189;
    auVar44._28_4_ = auVar90._28_4_ + auVar17._28_4_;
    auVar23 = vsubps_avx(auVar43,auVar44);
    auVar15 = vminps_avx(auVar91,auVar18);
    auVar89 = vmaxps_avx(auVar91,auVar18);
    auVar16 = vminps_avx(auVar123,auVar124);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar123,auVar124);
    auVar89 = vmaxps_avx(auVar89,auVar15);
    auVar17 = vminps_avx(auVar125,auVar22);
    auVar15 = vmaxps_avx(auVar125,auVar22);
    auVar18 = vminps_avx(auVar126,auVar23);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar16,auVar18);
    auVar16 = vmaxps_avx(auVar126,auVar23);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar89,auVar15);
    auVar89 = vcmpps_avx(auVar18,local_1c0,2);
    auVar15 = vcmpps_avx(auVar15,local_360,5);
    auVar89 = vandps_avx(auVar15,auVar89);
    auVar15 = local_2c0 & auVar89;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(auVar19,local_200);
      auVar16 = vsubps_avx(auVar20,auVar254);
      fVar213 = auVar15._0_4_ + auVar16._0_4_;
      fVar234 = auVar15._4_4_ + auVar16._4_4_;
      fVar214 = auVar15._8_4_ + auVar16._8_4_;
      fVar235 = auVar15._12_4_ + auVar16._12_4_;
      fVar215 = auVar15._16_4_ + auVar16._16_4_;
      fVar236 = auVar15._20_4_ + auVar16._20_4_;
      fVar216 = auVar15._24_4_ + auVar16._24_4_;
      auVar18 = vsubps_avx(local_220,auVar167);
      auVar22 = vsubps_avx(local_1e0,auVar278);
      fVar237 = auVar18._0_4_ + auVar22._0_4_;
      fVar217 = auVar18._4_4_ + auVar22._4_4_;
      fVar239 = auVar18._8_4_ + auVar22._8_4_;
      fVar187 = auVar18._12_4_ + auVar22._12_4_;
      fVar188 = auVar18._16_4_ + auVar22._16_4_;
      fVar189 = auVar18._20_4_ + auVar22._20_4_;
      fVar190 = auVar18._24_4_ + auVar22._24_4_;
      fVar219 = auVar22._28_4_;
      auVar45._4_4_ = auVar167._4_4_ * fVar234;
      auVar45._0_4_ = auVar167._0_4_ * fVar213;
      auVar45._8_4_ = auVar167._8_4_ * fVar214;
      auVar45._12_4_ = auVar167._12_4_ * fVar235;
      auVar45._16_4_ = auVar167._16_4_ * fVar215;
      auVar45._20_4_ = auVar167._20_4_ * fVar236;
      auVar45._24_4_ = auVar167._24_4_ * fVar216;
      auVar45._28_4_ = auVar167._28_4_;
      auVar46._4_4_ = local_200._4_4_ * fVar217;
      auVar46._0_4_ = local_200._0_4_ * fVar237;
      auVar46._8_4_ = local_200._8_4_ * fVar239;
      auVar46._12_4_ = local_200._12_4_ * fVar187;
      auVar46._16_4_ = local_200._16_4_ * fVar188;
      auVar46._20_4_ = local_200._20_4_ * fVar189;
      auVar46._24_4_ = local_200._24_4_ * fVar190;
      auVar46._28_4_ = local_200._28_4_;
      auVar22 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar234 * fStack_25c;
      auVar47._0_4_ = fVar213 * local_260;
      auVar47._8_4_ = fVar214 * fStack_258;
      auVar47._12_4_ = fVar235 * fStack_254;
      auVar47._16_4_ = fVar215 * fStack_250;
      auVar47._20_4_ = fVar236 * fStack_24c;
      auVar47._24_4_ = fVar216 * fStack_248;
      auVar47._28_4_ = auVar167._28_4_;
      auVar48._4_4_ = fVar217 * fStack_23c;
      auVar48._0_4_ = fVar237 * local_240;
      auVar48._8_4_ = fVar239 * fStack_238;
      auVar48._12_4_ = fVar187 * fStack_234;
      auVar48._16_4_ = fVar188 * fStack_230;
      auVar48._20_4_ = fVar189 * fStack_22c;
      auVar48._24_4_ = fVar190 * fStack_228;
      auVar48._28_4_ = fVar219;
      auVar23 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar234 * (float)local_660._4_4_;
      auVar49._0_4_ = fVar213 * (float)local_660._0_4_;
      auVar49._8_4_ = fVar214 * fStack_658;
      auVar49._12_4_ = fVar235 * fStack_654;
      auVar49._16_4_ = fVar215 * fStack_650;
      auVar49._20_4_ = fVar236 * fStack_64c;
      auVar49._24_4_ = fVar216 * fStack_648;
      auVar49._28_4_ = fVar219;
      auVar50._4_4_ = fVar217 * (float)local_6c0._4_4_;
      auVar50._0_4_ = fVar237 * (float)local_6c0._0_4_;
      auVar50._8_4_ = fVar239 * fStack_6b8;
      auVar50._12_4_ = fVar187 * fStack_6b4;
      auVar50._16_4_ = fVar188 * fStack_6b0;
      auVar50._20_4_ = fVar189 * fStack_6ac;
      auVar50._24_4_ = fVar190 * fStack_6a8;
      auVar50._28_4_ = auVar17._28_4_;
      auVar24 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_220._4_4_ * fVar234;
      auVar51._0_4_ = local_220._0_4_ * fVar213;
      auVar51._8_4_ = local_220._8_4_ * fVar214;
      auVar51._12_4_ = local_220._12_4_ * fVar235;
      auVar51._16_4_ = local_220._16_4_ * fVar215;
      auVar51._20_4_ = local_220._20_4_ * fVar236;
      auVar51._24_4_ = local_220._24_4_ * fVar216;
      auVar51._28_4_ = auVar17._28_4_;
      auVar52._4_4_ = auVar19._4_4_ * fVar217;
      auVar52._0_4_ = auVar19._0_4_ * fVar237;
      auVar52._8_4_ = auVar19._8_4_ * fVar239;
      auVar52._12_4_ = auVar19._12_4_ * fVar187;
      auVar52._16_4_ = auVar19._16_4_ * fVar188;
      auVar52._20_4_ = auVar19._20_4_ * fVar189;
      uVar4 = auVar19._28_4_;
      auVar52._24_4_ = auVar19._24_4_ * fVar190;
      auVar52._28_4_ = uVar4;
      auVar19 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar278._4_4_ * fVar234;
      auVar53._0_4_ = auVar278._0_4_ * fVar213;
      auVar53._8_4_ = auVar278._8_4_ * fVar214;
      auVar53._12_4_ = auVar278._12_4_ * fVar235;
      auVar53._16_4_ = auVar278._16_4_ * fVar215;
      auVar53._20_4_ = auVar278._20_4_ * fVar236;
      auVar53._24_4_ = auVar278._24_4_ * fVar216;
      auVar53._28_4_ = uVar4;
      auVar54._4_4_ = auVar254._4_4_ * fVar217;
      auVar54._0_4_ = auVar254._0_4_ * fVar237;
      auVar54._8_4_ = auVar254._8_4_ * fVar239;
      auVar54._12_4_ = auVar254._12_4_ * fVar187;
      auVar54._16_4_ = auVar254._16_4_ * fVar188;
      auVar54._20_4_ = auVar254._20_4_ * fVar189;
      auVar54._24_4_ = auVar254._24_4_ * fVar190;
      auVar54._28_4_ = auVar254._28_4_;
      auVar90 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar234 * fStack_29c;
      auVar55._0_4_ = fVar213 * local_2a0;
      auVar55._8_4_ = fVar214 * fStack_298;
      auVar55._12_4_ = fVar235 * fStack_294;
      auVar55._16_4_ = fVar215 * fStack_290;
      auVar55._20_4_ = fVar236 * fStack_28c;
      auVar55._24_4_ = fVar216 * fStack_288;
      auVar55._28_4_ = uVar4;
      auVar56._4_4_ = fVar217 * fStack_27c;
      auVar56._0_4_ = fVar237 * local_280;
      auVar56._8_4_ = fVar239 * fStack_278;
      auVar56._12_4_ = fVar187 * fStack_274;
      auVar56._16_4_ = fVar188 * fStack_270;
      auVar56._20_4_ = fVar189 * fStack_26c;
      auVar56._24_4_ = fVar190 * fStack_268;
      auVar56._28_4_ = auVar278._28_4_;
      auVar91 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar234 * auVar21._4_4_;
      auVar57._0_4_ = fVar213 * auVar21._0_4_;
      auVar57._8_4_ = fVar214 * auVar21._8_4_;
      auVar57._12_4_ = fVar235 * auVar21._12_4_;
      auVar57._16_4_ = fVar215 * auVar21._16_4_;
      auVar57._20_4_ = fVar236 * auVar21._20_4_;
      auVar57._24_4_ = fVar216 * auVar21._24_4_;
      auVar57._28_4_ = auVar278._28_4_;
      auVar58._4_4_ = fStack_61c * fVar217;
      auVar58._0_4_ = local_620 * fVar237;
      auVar58._8_4_ = fStack_618 * fVar239;
      auVar58._12_4_ = fStack_614 * fVar187;
      auVar58._16_4_ = fStack_610 * fVar188;
      auVar58._20_4_ = fStack_60c * fVar189;
      auVar58._24_4_ = fStack_608 * fVar190;
      auVar58._28_4_ = local_220._28_4_;
      auVar21 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = local_1e0._4_4_ * fVar234;
      auVar59._0_4_ = local_1e0._0_4_ * fVar213;
      auVar59._8_4_ = local_1e0._8_4_ * fVar214;
      auVar59._12_4_ = local_1e0._12_4_ * fVar235;
      auVar59._16_4_ = local_1e0._16_4_ * fVar215;
      auVar59._20_4_ = local_1e0._20_4_ * fVar236;
      auVar59._24_4_ = local_1e0._24_4_ * fVar216;
      auVar59._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar60._4_4_ = auVar20._4_4_ * fVar217;
      auVar60._0_4_ = auVar20._0_4_ * fVar237;
      auVar60._8_4_ = auVar20._8_4_ * fVar239;
      auVar60._12_4_ = auVar20._12_4_ * fVar187;
      auVar60._16_4_ = auVar20._16_4_ * fVar188;
      auVar60._20_4_ = auVar20._20_4_ * fVar189;
      auVar60._24_4_ = auVar20._24_4_ * fVar190;
      auVar60._28_4_ = auVar18._28_4_ + fVar219;
      auVar20 = vsubps_avx(auVar59,auVar60);
      auVar16 = vminps_avx(auVar22,auVar23);
      auVar15 = vmaxps_avx(auVar22,auVar23);
      auVar17 = vminps_avx(auVar24,auVar19);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar24,auVar19);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar18 = vminps_avx(auVar90,auVar91);
      auVar16 = vmaxps_avx(auVar90,auVar91);
      auVar19 = vminps_avx(auVar21,auVar20);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar21,auVar20);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar18,local_1c0,2);
      auVar16 = vcmpps_avx(auVar16,local_360,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar89 = vandps_avx(local_2c0,auVar89);
      auVar16 = auVar89 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar15,auVar89);
        uVar70 = vmovmskps_avx(auVar89);
        if (uVar70 != 0) {
          uVar68 = (ulong)uVar72;
          auStack_4b0[uVar68] = uVar70 & 0xff;
          uVar5 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar68 * 2) = uVar5;
          uVar66 = vmovlps_avx(auVar100);
          auStack_1a0[uVar68] = uVar66;
          uVar72 = uVar72 + 1;
        }
      }
    }
LAB_0106c145:
    do {
      do {
        do {
          do {
            if (uVar72 == 0) {
              if (bVar63) {
                return bVar63;
              }
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar99._4_4_ = uVar4;
              auVar99._0_4_ = uVar4;
              auVar99._8_4_ = uVar4;
              auVar99._12_4_ = uVar4;
              auVar99._16_4_ = uVar4;
              auVar99._20_4_ = uVar4;
              auVar99._24_4_ = uVar4;
              auVar99._28_4_ = uVar4;
              auVar89 = vcmpps_avx(local_2e0,auVar99,2);
              uVar67 = vmovmskps_avx(auVar89);
              uVar65 = uVar65 & uVar65 + 0xff & uVar67;
              if (uVar65 == 0) {
                return bVar63;
              }
              goto LAB_0106b2fa;
            }
            uVar68 = (ulong)(uVar72 - 1);
            uVar70 = auStack_4b0[uVar68];
            fVar219 = afStack_340[uVar68 * 2];
            fVar213 = afStack_340[uVar68 * 2 + 1];
            auVar200._8_8_ = 0;
            auVar200._0_8_ = auStack_1a0[uVar68];
            auVar212 = ZEXT1664(auVar200);
            uVar66 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_4b0[uVar68] = uVar70;
            if (uVar70 == 0) {
              uVar72 = uVar72 - 1;
            }
            fVar214 = (float)(uVar66 + 1) * 0.14285715;
            fVar234 = (1.0 - (float)uVar66 * 0.14285715) * fVar219 +
                      fVar213 * (float)uVar66 * 0.14285715;
            fVar219 = (1.0 - fVar214) * fVar219 + fVar213 * fVar214;
            fVar213 = fVar219 - fVar234;
            if (0.16666667 <= fVar213) {
              auVar78 = vinsertps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar219),0x10);
              auVar299 = ZEXT1664(auVar78);
              goto LAB_0106bae0;
            }
            auVar78 = vshufps_avx(auVar200,auVar200,0x50);
            auVar105._8_4_ = 0x3f800000;
            auVar105._0_8_ = 0x3f8000003f800000;
            auVar105._12_4_ = 0x3f800000;
            auVar224 = vsubps_avx(auVar105,auVar78);
            fVar214 = auVar78._0_4_;
            fVar235 = auVar78._4_4_;
            fVar215 = auVar78._8_4_;
            fVar236 = auVar78._12_4_;
            fVar216 = auVar224._0_4_;
            fVar237 = auVar224._4_4_;
            fVar217 = auVar224._8_4_;
            fVar239 = auVar224._12_4_;
            auVar137._0_4_ = fVar214 * auVar281._0_4_ + fVar216 * fVar218;
            auVar137._4_4_ = fVar235 * auVar281._4_4_ + fVar237 * fVar168;
            auVar137._8_4_ = fVar215 * auVar281._0_4_ + fVar217 * fVar218;
            auVar137._12_4_ = fVar236 * auVar281._4_4_ + fVar239 * fVar168;
            auVar172._0_4_ = auVar260._0_4_ * fVar214 + fVar240 * fVar216;
            auVar172._4_4_ = auVar260._4_4_ * fVar235 + fVar186 * fVar237;
            auVar172._8_4_ = auVar260._0_4_ * fVar215 + fVar240 * fVar217;
            auVar172._12_4_ = auVar260._4_4_ * fVar236 + fVar186 * fVar239;
            auVar201._0_4_ = auVar270._0_4_ * fVar214 + auVar304._0_4_ * fVar216;
            auVar201._4_4_ = auVar270._4_4_ * fVar235 + auVar304._4_4_ * fVar237;
            auVar201._8_4_ = auVar270._0_4_ * fVar215 + auVar304._0_4_ * fVar217;
            auVar201._12_4_ = auVar270._4_4_ * fVar236 + auVar304._4_4_ * fVar239;
            auVar75._0_4_ = auVar104._0_4_ * fVar214 + auVar315._0_4_ * fVar216;
            auVar75._4_4_ = auVar104._4_4_ * fVar235 + auVar315._4_4_ * fVar237;
            auVar75._8_4_ = auVar104._0_4_ * fVar215 + auVar315._0_4_ * fVar217;
            auVar75._12_4_ = auVar104._4_4_ * fVar236 + auVar315._4_4_ * fVar239;
            auVar128._16_16_ = auVar137;
            auVar128._0_16_ = auVar137;
            auVar155._16_16_ = auVar172;
            auVar155._0_16_ = auVar172;
            auVar185._16_16_ = auVar201;
            auVar185._0_16_ = auVar201;
            auVar89 = ZEXT2032(CONCAT416(fVar219,ZEXT416((uint)fVar234)));
            auVar89 = vshufps_avx(auVar89,auVar89,0);
            auVar15 = vsubps_avx(auVar155,auVar128);
            fVar214 = auVar89._0_4_;
            fVar235 = auVar89._4_4_;
            fVar215 = auVar89._8_4_;
            fVar236 = auVar89._12_4_;
            fVar216 = auVar89._16_4_;
            fVar237 = auVar89._20_4_;
            fVar217 = auVar89._24_4_;
            auVar129._0_4_ = auVar137._0_4_ + auVar15._0_4_ * fVar214;
            auVar129._4_4_ = auVar137._4_4_ + auVar15._4_4_ * fVar235;
            auVar129._8_4_ = auVar137._8_4_ + auVar15._8_4_ * fVar215;
            auVar129._12_4_ = auVar137._12_4_ + auVar15._12_4_ * fVar236;
            auVar129._16_4_ = auVar137._0_4_ + auVar15._16_4_ * fVar216;
            auVar129._20_4_ = auVar137._4_4_ + auVar15._20_4_ * fVar237;
            auVar129._24_4_ = auVar137._8_4_ + auVar15._24_4_ * fVar217;
            auVar129._28_4_ = auVar137._12_4_ + auVar15._28_4_;
            auVar89 = vsubps_avx(auVar185,auVar155);
            auVar156._0_4_ = auVar172._0_4_ + auVar89._0_4_ * fVar214;
            auVar156._4_4_ = auVar172._4_4_ + auVar89._4_4_ * fVar235;
            auVar156._8_4_ = auVar172._8_4_ + auVar89._8_4_ * fVar215;
            auVar156._12_4_ = auVar172._12_4_ + auVar89._12_4_ * fVar236;
            auVar156._16_4_ = auVar172._0_4_ + auVar89._16_4_ * fVar216;
            auVar156._20_4_ = auVar172._4_4_ + auVar89._20_4_ * fVar237;
            auVar156._24_4_ = auVar172._8_4_ + auVar89._24_4_ * fVar217;
            auVar156._28_4_ = auVar172._12_4_ + auVar89._28_4_;
            auVar78 = vsubps_avx(auVar75,auVar201);
            auVar96._0_4_ = auVar201._0_4_ + auVar78._0_4_ * fVar214;
            auVar96._4_4_ = auVar201._4_4_ + auVar78._4_4_ * fVar235;
            auVar96._8_4_ = auVar201._8_4_ + auVar78._8_4_ * fVar215;
            auVar96._12_4_ = auVar201._12_4_ + auVar78._12_4_ * fVar236;
            auVar96._16_4_ = auVar201._0_4_ + auVar78._0_4_ * fVar216;
            auVar96._20_4_ = auVar201._4_4_ + auVar78._4_4_ * fVar237;
            auVar96._24_4_ = auVar201._8_4_ + auVar78._8_4_ * fVar217;
            auVar96._28_4_ = auVar201._12_4_ + auVar78._12_4_;
            auVar89 = vsubps_avx(auVar156,auVar129);
            auVar130._0_4_ = auVar129._0_4_ + fVar214 * auVar89._0_4_;
            auVar130._4_4_ = auVar129._4_4_ + fVar235 * auVar89._4_4_;
            auVar130._8_4_ = auVar129._8_4_ + fVar215 * auVar89._8_4_;
            auVar130._12_4_ = auVar129._12_4_ + fVar236 * auVar89._12_4_;
            auVar130._16_4_ = auVar129._16_4_ + fVar216 * auVar89._16_4_;
            auVar130._20_4_ = auVar129._20_4_ + fVar237 * auVar89._20_4_;
            auVar130._24_4_ = auVar129._24_4_ + fVar217 * auVar89._24_4_;
            auVar130._28_4_ = auVar129._28_4_ + auVar89._28_4_;
            auVar89 = vsubps_avx(auVar96,auVar156);
            auVar97._0_4_ = auVar156._0_4_ + fVar214 * auVar89._0_4_;
            auVar97._4_4_ = auVar156._4_4_ + fVar235 * auVar89._4_4_;
            auVar97._8_4_ = auVar156._8_4_ + fVar215 * auVar89._8_4_;
            auVar97._12_4_ = auVar156._12_4_ + fVar236 * auVar89._12_4_;
            auVar97._16_4_ = auVar156._16_4_ + fVar216 * auVar89._16_4_;
            auVar97._20_4_ = auVar156._20_4_ + fVar237 * auVar89._20_4_;
            auVar97._24_4_ = auVar156._24_4_ + fVar217 * auVar89._24_4_;
            auVar97._28_4_ = auVar156._28_4_ + auVar89._28_4_;
            auVar89 = vsubps_avx(auVar97,auVar130);
            auVar227._0_4_ = auVar130._0_4_ + fVar214 * auVar89._0_4_;
            auVar227._4_4_ = auVar130._4_4_ + fVar235 * auVar89._4_4_;
            auVar227._8_4_ = auVar130._8_4_ + fVar215 * auVar89._8_4_;
            auVar227._12_4_ = auVar130._12_4_ + fVar236 * auVar89._12_4_;
            auVar233._16_4_ = auVar130._16_4_ + fVar216 * auVar89._16_4_;
            auVar233._0_16_ = auVar227;
            auVar233._20_4_ = auVar130._20_4_ + fVar237 * auVar89._20_4_;
            auVar233._24_4_ = auVar130._24_4_ + fVar217 * auVar89._24_4_;
            auVar233._28_4_ = auVar130._28_4_ + auVar156._28_4_;
            auVar238 = auVar233._16_16_;
            auVar107 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.33333334)),
                                   ZEXT416((uint)(fVar213 * 0.33333334)),0);
            auVar202._0_4_ = auVar227._0_4_ + auVar107._0_4_ * auVar89._0_4_ * 3.0;
            auVar202._4_4_ = auVar227._4_4_ + auVar107._4_4_ * auVar89._4_4_ * 3.0;
            auVar202._8_4_ = auVar227._8_4_ + auVar107._8_4_ * auVar89._8_4_ * 3.0;
            auVar202._12_4_ = auVar227._12_4_ + auVar107._12_4_ * auVar89._12_4_ * 3.0;
            auVar150 = vshufpd_avx(auVar227,auVar227,3);
            auVar118 = vshufpd_avx(auVar238,auVar238,3);
            auVar78 = vsubps_avx(auVar150,auVar227);
            auVar224 = vsubps_avx(auVar118,auVar238);
            auVar76._0_4_ = auVar78._0_4_ + auVar224._0_4_;
            auVar76._4_4_ = auVar78._4_4_ + auVar224._4_4_;
            auVar76._8_4_ = auVar78._8_4_ + auVar224._8_4_;
            auVar76._12_4_ = auVar78._12_4_ + auVar224._12_4_;
            auVar78 = vmovshdup_avx(auVar227);
            auVar224 = vmovshdup_avx(auVar202);
            auVar140 = vshufps_avx(auVar76,auVar76,0);
            auVar108 = vshufps_avx(auVar76,auVar76,0x55);
            fVar214 = auVar108._0_4_;
            fVar235 = auVar108._4_4_;
            fVar215 = auVar108._8_4_;
            fVar236 = auVar108._12_4_;
            fVar216 = auVar140._0_4_;
            fVar237 = auVar140._4_4_;
            fVar217 = auVar140._8_4_;
            fVar239 = auVar140._12_4_;
            auVar77._0_4_ = fVar216 * auVar227._0_4_ + auVar78._0_4_ * fVar214;
            auVar77._4_4_ = fVar237 * auVar227._4_4_ + auVar78._4_4_ * fVar235;
            auVar77._8_4_ = fVar217 * auVar227._8_4_ + auVar78._8_4_ * fVar215;
            auVar77._12_4_ = fVar239 * auVar227._12_4_ + auVar78._12_4_ * fVar236;
            auVar138._0_4_ = fVar216 * auVar202._0_4_ + auVar224._0_4_ * fVar214;
            auVar138._4_4_ = fVar237 * auVar202._4_4_ + auVar224._4_4_ * fVar235;
            auVar138._8_4_ = fVar217 * auVar202._8_4_ + auVar224._8_4_ * fVar215;
            auVar138._12_4_ = fVar239 * auVar202._12_4_ + auVar224._12_4_ * fVar236;
            auVar224 = vshufps_avx(auVar77,auVar77,0xe8);
            auVar140 = vshufps_avx(auVar138,auVar138,0xe8);
            auVar78 = vcmpps_avx(auVar224,auVar140,1);
            uVar70 = vextractps_avx(auVar78,0);
            auVar108 = auVar138;
            if ((uVar70 & 1) == 0) {
              auVar108 = auVar77;
            }
            auVar106._0_4_ = auVar107._0_4_ * auVar89._16_4_ * 3.0;
            auVar106._4_4_ = auVar107._4_4_ * auVar89._20_4_ * 3.0;
            auVar106._8_4_ = auVar107._8_4_ * auVar89._24_4_ * 3.0;
            auVar106._12_4_ = auVar107._12_4_ * 0.0;
            auVar73 = vsubps_avx(auVar238,auVar106);
            auVar107 = vmovshdup_avx(auVar73);
            auVar238 = vmovshdup_avx(auVar238);
            fVar187 = auVar73._0_4_;
            fVar188 = auVar73._4_4_;
            auVar173._0_4_ = fVar187 * fVar216 + auVar107._0_4_ * fVar214;
            auVar173._4_4_ = fVar188 * fVar237 + auVar107._4_4_ * fVar235;
            auVar173._8_4_ = auVar73._8_4_ * fVar217 + auVar107._8_4_ * fVar215;
            auVar173._12_4_ = auVar73._12_4_ * fVar239 + auVar107._12_4_ * fVar236;
            auVar203._0_4_ = fVar216 * auVar233._16_4_ + auVar238._0_4_ * fVar214;
            auVar203._4_4_ = fVar237 * auVar233._20_4_ + auVar238._4_4_ * fVar235;
            auVar203._8_4_ = fVar217 * auVar233._24_4_ + auVar238._8_4_ * fVar215;
            auVar203._12_4_ = fVar239 * auVar233._28_4_ + auVar238._12_4_ * fVar236;
            auVar238 = vshufps_avx(auVar173,auVar173,0xe8);
            auVar9 = vshufps_avx(auVar203,auVar203,0xe8);
            auVar107 = vcmpps_avx(auVar238,auVar9,1);
            uVar70 = vextractps_avx(auVar107,0);
            auVar100 = auVar203;
            if ((uVar70 & 1) == 0) {
              auVar100 = auVar173;
            }
            auVar108 = vmaxss_avx(auVar100,auVar108);
            auVar224 = vminps_avx(auVar224,auVar140);
            auVar140 = vminps_avx(auVar238,auVar9);
            auVar140 = vminps_avx(auVar224,auVar140);
            auVar78 = vshufps_avx(auVar78,auVar78,0x55);
            auVar78 = vblendps_avx(auVar78,auVar107,2);
            auVar107 = vpslld_avx(auVar78,0x1f);
            auVar78 = vshufpd_avx(auVar138,auVar138,1);
            auVar78 = vinsertps_avx(auVar78,auVar203,0x9c);
            auVar224 = vshufpd_avx(auVar77,auVar77,1);
            auVar224 = vinsertps_avx(auVar224,auVar173,0x9c);
            auVar78 = vblendvps_avx(auVar224,auVar78,auVar107);
            auVar224 = vmovshdup_avx(auVar78);
            auVar78 = vmaxss_avx(auVar224,auVar78);
            fVar215 = auVar140._0_4_;
            auVar224 = vmovshdup_avx(auVar140);
            fVar235 = auVar78._0_4_;
            fVar236 = auVar224._0_4_;
            fVar214 = auVar108._0_4_;
            if ((fVar215 < 0.0001) && (-0.0001 < fVar235)) break;
            if ((fVar236 < 0.0001 && -0.0001 < fVar214) || (fVar215 < 0.0001 && -0.0001 < fVar214))
            break;
            auVar107 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar78,1);
            auVar224 = vcmpps_avx(auVar224,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar224 = vandps_avx(auVar224,auVar107);
          } while ((auVar224 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar107 = vcmpps_avx(auVar140,_DAT_01f7aa10,1);
          auVar224 = vcmpss_avx(auVar108,ZEXT416(0),1);
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar174._8_4_ = 0xbf800000;
          auVar174._0_8_ = 0xbf800000bf800000;
          auVar174._12_4_ = 0xbf800000;
          auVar224 = vblendvps_avx(auVar139,auVar174,auVar224);
          auVar107 = vblendvps_avx(auVar139,auVar174,auVar107);
          auVar140 = vcmpss_avx(auVar107,auVar224,4);
          auVar140 = vpshufd_avx(ZEXT416(auVar140._0_4_ & 1),0x50);
          auVar140 = vpslld_avx(auVar140,0x1f);
          auVar140 = vpsrad_avx(auVar140,0x1f);
          auVar140 = vpandn_avx(auVar140,_DAT_01fafeb0);
          auVar108 = vmovshdup_avx(auVar107);
          fVar216 = auVar108._0_4_;
          local_630 = auVar6._0_4_;
          fStack_62c = auVar6._4_4_;
          fStack_628 = auVar6._8_4_;
          fStack_624 = auVar6._12_4_;
          if ((auVar107._0_4_ != fVar216) || (NAN(auVar107._0_4_) || NAN(fVar216))) {
            if ((fVar236 != fVar215) || (NAN(fVar236) || NAN(fVar215))) {
              fVar215 = -fVar215 / (fVar236 - fVar215);
              auVar107 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar215) * 0.0 + fVar215)));
            }
            else {
              auVar107 = ZEXT816(0x3f80000000000000);
              if ((fVar215 != 0.0) || (NAN(fVar215))) {
                auVar107 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar238 = vcmpps_avx(auVar140,auVar107,1);
            auVar108 = vblendps_avx(auVar140,auVar107,2);
            auVar107 = vblendps_avx(auVar107,auVar140,2);
            auVar140 = vblendvps_avx(auVar107,auVar108,auVar238);
          }
          auVar78 = vcmpss_avx(auVar78,ZEXT416(0),1);
          auVar141._8_4_ = 0x3f800000;
          auVar141._0_8_ = 0x3f8000003f800000;
          auVar141._12_4_ = 0x3f800000;
          auVar175._8_4_ = 0xbf800000;
          auVar175._0_8_ = 0xbf800000bf800000;
          auVar175._12_4_ = 0xbf800000;
          auVar78 = vblendvps_avx(auVar141,auVar175,auVar78);
          fVar215 = auVar78._0_4_;
          if ((auVar224._0_4_ != fVar215) || (NAN(auVar224._0_4_) || NAN(fVar215))) {
            if ((fVar235 != fVar214) || (NAN(fVar235) || NAN(fVar214))) {
              fVar214 = -fVar214 / (fVar235 - fVar214);
              auVar78 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar214) * 0.0 + fVar214)));
            }
            else {
              auVar78 = ZEXT816(0x3f80000000000000);
              if ((fVar214 != 0.0) || (NAN(fVar214))) {
                auVar78 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar107 = vcmpps_avx(auVar140,auVar78,1);
            auVar224 = vblendps_avx(auVar140,auVar78,2);
            auVar78 = vblendps_avx(auVar78,auVar140,2);
            auVar140 = vblendvps_avx(auVar78,auVar224,auVar107);
          }
          if ((fVar216 != fVar215) || (NAN(fVar216) || NAN(fVar215))) {
            auVar79._8_4_ = 0x3f800000;
            auVar79._0_8_ = 0x3f8000003f800000;
            auVar79._12_4_ = 0x3f800000;
            auVar78 = vcmpps_avx(auVar140,auVar79,1);
            auVar224 = vinsertps_avx(auVar140,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar142._4_12_ = auVar140._4_12_;
            auVar142._0_4_ = 0x3f800000;
            auVar140 = vblendvps_avx(auVar142,auVar224,auVar78);
          }
          auVar78 = vcmpps_avx(auVar140,_DAT_01f7b6f0,1);
          auVar61._12_4_ = 0;
          auVar61._0_12_ = auVar140._4_12_;
          auVar224 = vinsertps_avx(auVar140,ZEXT416(0x3f800000),0x10);
          auVar78 = vblendvps_avx(auVar224,auVar61 << 0x20,auVar78);
          auVar224 = vmovshdup_avx(auVar78);
        } while (auVar224._0_4_ < auVar78._0_4_);
        auVar80._0_4_ = auVar78._0_4_ + -0.1;
        auVar80._4_4_ = auVar78._4_4_ + 0.1;
        auVar80._8_4_ = auVar78._8_4_ + 0.0;
        auVar80._12_4_ = auVar78._12_4_ + 0.0;
        auVar107 = vshufpd_avx(auVar202,auVar202,3);
        auVar228._8_8_ = 0x3f80000000000000;
        auVar228._0_8_ = 0x3f80000000000000;
        auVar78 = vcmpps_avx(auVar80,auVar228,1);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = auVar80._4_12_;
        auVar224 = vinsertps_avx(auVar80,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar78 = vblendvps_avx(auVar224,auVar62 << 0x20,auVar78);
        auVar224 = vshufpd_avx(auVar73,auVar73,3);
        auVar140 = vshufps_avx(auVar78,auVar78,0x50);
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = 0x3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar108 = vsubps_avx(auVar229,auVar140);
        local_600 = auVar150._0_4_;
        fStack_5fc = auVar150._4_4_;
        fStack_5f8 = auVar150._8_4_;
        fStack_5f4 = auVar150._12_4_;
        fVar214 = auVar140._0_4_;
        fVar235 = auVar140._4_4_;
        fVar215 = auVar140._8_4_;
        fVar236 = auVar140._12_4_;
        local_680 = auVar118._0_4_;
        fStack_67c = auVar118._4_4_;
        fStack_678 = auVar118._8_4_;
        fStack_674 = auVar118._12_4_;
        fVar216 = auVar108._0_4_;
        fVar237 = auVar108._4_4_;
        fVar217 = auVar108._8_4_;
        fVar239 = auVar108._12_4_;
        auVar81._0_4_ = fVar214 * local_600 + fVar216 * auVar227._0_4_;
        auVar81._4_4_ = fVar235 * fStack_5fc + fVar237 * auVar227._4_4_;
        auVar81._8_4_ = fVar215 * fStack_5f8 + fVar217 * auVar227._0_4_;
        auVar81._12_4_ = fVar236 * fStack_5f4 + fVar239 * auVar227._4_4_;
        auVar143._0_4_ = fVar214 * auVar107._0_4_ + fVar216 * auVar202._0_4_;
        auVar143._4_4_ = fVar235 * auVar107._4_4_ + fVar237 * auVar202._4_4_;
        auVar143._8_4_ = fVar215 * auVar107._8_4_ + fVar217 * auVar202._0_4_;
        auVar143._12_4_ = fVar236 * auVar107._12_4_ + fVar239 * auVar202._4_4_;
        auVar204._0_4_ = fVar214 * auVar224._0_4_ + fVar216 * fVar187;
        auVar204._4_4_ = fVar235 * auVar224._4_4_ + fVar237 * fVar188;
        auVar204._8_4_ = fVar215 * auVar224._8_4_ + fVar217 * fVar187;
        auVar204._12_4_ = fVar236 * auVar224._12_4_ + fVar239 * fVar188;
        auVar247._0_4_ = fVar214 * local_680 + fVar216 * auVar233._16_4_;
        auVar247._4_4_ = fVar235 * fStack_67c + fVar237 * auVar233._20_4_;
        auVar247._8_4_ = fVar215 * fStack_678 + fVar217 * auVar233._16_4_;
        auVar247._12_4_ = fVar236 * fStack_674 + fVar239 * auVar233._20_4_;
        auVar118 = vsubps_avx(auVar229,auVar78);
        auVar224 = vmovshdup_avx(auVar200);
        auVar150 = vmovsldup_avx(auVar200);
        auVar230._0_4_ = auVar150._0_4_ * auVar118._0_4_ + auVar78._0_4_ * auVar224._0_4_;
        auVar230._4_4_ = auVar150._4_4_ * auVar118._4_4_ + auVar78._4_4_ * auVar224._4_4_;
        auVar230._8_4_ = auVar150._8_4_ * auVar118._8_4_ + auVar78._8_4_ * auVar224._8_4_;
        auVar230._12_4_ = auVar150._12_4_ * auVar118._12_4_ + auVar78._12_4_ * auVar224._12_4_;
        auVar73 = vmovshdup_avx(auVar230);
        auVar78 = vsubps_avx(auVar143,auVar81);
        auVar161._0_4_ = auVar78._0_4_ * 3.0;
        auVar161._4_4_ = auVar78._4_4_ * 3.0;
        auVar161._8_4_ = auVar78._8_4_ * 3.0;
        auVar161._12_4_ = auVar78._12_4_ * 3.0;
        auVar78 = vsubps_avx(auVar204,auVar143);
        auVar261._0_4_ = auVar78._0_4_ * 3.0;
        auVar261._4_4_ = auVar78._4_4_ * 3.0;
        auVar261._8_4_ = auVar78._8_4_ * 3.0;
        auVar261._12_4_ = auVar78._12_4_ * 3.0;
        auVar78 = vsubps_avx(auVar247,auVar204);
        auVar271._0_4_ = auVar78._0_4_ * 3.0;
        auVar271._4_4_ = auVar78._4_4_ * 3.0;
        auVar271._8_4_ = auVar78._8_4_ * 3.0;
        auVar271._12_4_ = auVar78._12_4_ * 3.0;
        auVar224 = vminps_avx(auVar261,auVar271);
        auVar78 = vmaxps_avx(auVar261,auVar271);
        auVar224 = vminps_avx(auVar161,auVar224);
        auVar78 = vmaxps_avx(auVar161,auVar78);
        auVar150 = vshufpd_avx(auVar224,auVar224,3);
        auVar118 = vshufpd_avx(auVar78,auVar78,3);
        auVar224 = vminps_avx(auVar224,auVar150);
        auVar78 = vmaxps_avx(auVar78,auVar118);
        auVar150 = vshufps_avx(ZEXT416((uint)(1.0 / fVar213)),ZEXT416((uint)(1.0 / fVar213)),0);
        auVar262._0_4_ = auVar224._0_4_ * auVar150._0_4_;
        auVar262._4_4_ = auVar224._4_4_ * auVar150._4_4_;
        auVar262._8_4_ = auVar224._8_4_ * auVar150._8_4_;
        auVar262._12_4_ = auVar224._12_4_ * auVar150._12_4_;
        auVar272._0_4_ = auVar150._0_4_ * auVar78._0_4_;
        auVar272._4_4_ = auVar150._4_4_ * auVar78._4_4_;
        auVar272._8_4_ = auVar150._8_4_ * auVar78._8_4_;
        auVar272._12_4_ = auVar150._12_4_ * auVar78._12_4_;
        auVar108 = ZEXT416((uint)(1.0 / (auVar73._0_4_ - auVar230._0_4_)));
        auVar78 = vshufpd_avx(auVar81,auVar81,3);
        auVar224 = vshufpd_avx(auVar143,auVar143,3);
        auVar150 = vshufpd_avx(auVar204,auVar204,3);
        auVar118 = vshufpd_avx(auVar247,auVar247,3);
        auVar78 = vsubps_avx(auVar78,auVar81);
        auVar107 = vsubps_avx(auVar224,auVar143);
        auVar140 = vsubps_avx(auVar150,auVar204);
        auVar118 = vsubps_avx(auVar118,auVar247);
        auVar224 = vminps_avx(auVar78,auVar107);
        auVar78 = vmaxps_avx(auVar78,auVar107);
        auVar150 = vminps_avx(auVar140,auVar118);
        auVar150 = vminps_avx(auVar224,auVar150);
        auVar224 = vmaxps_avx(auVar140,auVar118);
        auVar78 = vmaxps_avx(auVar78,auVar224);
        auVar224 = vshufps_avx(auVar108,auVar108,0);
        auVar316._0_4_ = auVar224._0_4_ * auVar150._0_4_;
        auVar316._4_4_ = auVar224._4_4_ * auVar150._4_4_;
        auVar316._8_4_ = auVar224._8_4_ * auVar150._8_4_;
        auVar316._12_4_ = auVar224._12_4_ * auVar150._12_4_;
        auVar326._0_4_ = auVar224._0_4_ * auVar78._0_4_;
        auVar326._4_4_ = auVar224._4_4_ * auVar78._4_4_;
        auVar326._8_4_ = auVar224._8_4_ * auVar78._8_4_;
        auVar326._12_4_ = auVar224._12_4_ * auVar78._12_4_;
        auVar78 = vmovsldup_avx(auVar230);
        auVar282._4_12_ = auVar78._4_12_;
        auVar282._0_4_ = fVar234;
        auVar292._4_12_ = auVar230._4_12_;
        auVar292._0_4_ = fVar219;
        auVar162._0_4_ = (fVar234 + fVar219) * 0.5;
        auVar162._4_4_ = (auVar78._4_4_ + auVar230._4_4_) * 0.5;
        auVar162._8_4_ = (auVar78._8_4_ + auVar230._8_4_) * 0.5;
        auVar162._12_4_ = (auVar78._12_4_ + auVar230._12_4_) * 0.5;
        auVar78 = vshufps_avx(auVar162,auVar162,0);
        fVar214 = auVar78._0_4_;
        fVar235 = auVar78._4_4_;
        fVar215 = auVar78._8_4_;
        fVar236 = auVar78._12_4_;
        auVar109._0_4_ = local_630 + fVar214 * (float)local_370._0_4_;
        auVar109._4_4_ = fStack_62c + fVar235 * (float)local_370._4_4_;
        auVar109._8_4_ = fStack_628 + fVar215 * fStack_368;
        auVar109._12_4_ = fStack_624 + fVar236 * fStack_364;
        local_590 = auVar7._0_4_;
        fStack_58c = auVar7._4_4_;
        fStack_588 = auVar7._8_4_;
        fStack_584 = auVar7._12_4_;
        auVar144._0_4_ = fVar214 * (float)local_380._0_4_ + local_590;
        auVar144._4_4_ = fVar235 * (float)local_380._4_4_ + fStack_58c;
        auVar144._8_4_ = fVar215 * fStack_378 + fStack_588;
        auVar144._12_4_ = fVar236 * fStack_374 + fStack_584;
        local_5a0 = auVar8._0_4_;
        fStack_59c = auVar8._4_4_;
        fStack_598 = auVar8._8_4_;
        fStack_594 = auVar8._12_4_;
        auVar205._0_4_ = fVar214 * (float)local_390._0_4_ + local_5a0;
        auVar205._4_4_ = fVar235 * (float)local_390._4_4_ + fStack_59c;
        auVar205._8_4_ = fVar215 * fStack_388 + fStack_598;
        auVar205._12_4_ = fVar236 * fStack_384 + fStack_594;
        auVar78 = vsubps_avx(auVar144,auVar109);
        auVar110._0_4_ = auVar109._0_4_ + fVar214 * auVar78._0_4_;
        auVar110._4_4_ = auVar109._4_4_ + fVar235 * auVar78._4_4_;
        auVar110._8_4_ = auVar109._8_4_ + fVar215 * auVar78._8_4_;
        auVar110._12_4_ = auVar109._12_4_ + fVar236 * auVar78._12_4_;
        auVar78 = vsubps_avx(auVar205,auVar144);
        auVar145._0_4_ = auVar144._0_4_ + fVar214 * auVar78._0_4_;
        auVar145._4_4_ = auVar144._4_4_ + fVar235 * auVar78._4_4_;
        auVar145._8_4_ = auVar144._8_4_ + fVar215 * auVar78._8_4_;
        auVar145._12_4_ = auVar144._12_4_ + fVar236 * auVar78._12_4_;
        auVar78 = vsubps_avx(auVar145,auVar110);
        fVar214 = auVar110._0_4_ + fVar214 * auVar78._0_4_;
        fVar235 = auVar110._4_4_ + fVar235 * auVar78._4_4_;
        auVar82._0_8_ = CONCAT44(fVar235,fVar214);
        auVar82._8_4_ = auVar110._8_4_ + fVar215 * auVar78._8_4_;
        auVar82._12_4_ = auVar110._12_4_ + fVar236 * auVar78._12_4_;
        fVar215 = auVar78._0_4_ * 3.0;
        fVar236 = auVar78._4_4_ * 3.0;
        auVar111._0_8_ = CONCAT44(fVar236,fVar215);
        auVar111._8_4_ = auVar78._8_4_ * 3.0;
        auVar111._12_4_ = auVar78._12_4_ * 3.0;
        auVar146._8_8_ = auVar82._0_8_;
        auVar146._0_8_ = auVar82._0_8_;
        auVar78 = vshufpd_avx(auVar82,auVar82,3);
        auVar224 = vshufps_avx(auVar162,auVar162,0x55);
        auVar140 = vsubps_avx(auVar78,auVar146);
        auVar305._0_4_ = auVar140._0_4_ * auVar224._0_4_ + fVar214;
        auVar305._4_4_ = auVar140._4_4_ * auVar224._4_4_ + fVar235;
        auVar305._8_4_ = auVar140._8_4_ * auVar224._8_4_ + fVar214;
        auVar305._12_4_ = auVar140._12_4_ * auVar224._12_4_ + fVar235;
        auVar147._8_8_ = auVar111._0_8_;
        auVar147._0_8_ = auVar111._0_8_;
        auVar78 = vshufpd_avx(auVar111,auVar111,1);
        auVar78 = vsubps_avx(auVar78,auVar147);
        auVar112._0_4_ = auVar78._0_4_ * auVar224._0_4_ + fVar215;
        auVar112._4_4_ = auVar78._4_4_ * auVar224._4_4_ + fVar236;
        auVar112._8_4_ = auVar78._8_4_ * auVar224._8_4_ + fVar215;
        auVar112._12_4_ = auVar78._12_4_ * auVar224._12_4_ + fVar236;
        auVar224 = vmovshdup_avx(auVar112);
        auVar206._0_8_ = auVar224._0_8_ ^ 0x8000000080000000;
        auVar206._8_4_ = auVar224._8_4_ ^ 0x80000000;
        auVar206._12_4_ = auVar224._12_4_ ^ 0x80000000;
        auVar150 = vmovshdup_avx(auVar140);
        auVar78 = vunpcklps_avx(auVar150,auVar206);
        auVar118 = vshufps_avx(auVar78,auVar206,4);
        auVar83._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
        auVar83._8_4_ = -auVar140._8_4_;
        auVar83._12_4_ = -auVar140._12_4_;
        auVar78 = vmovlhps_avx(auVar83,auVar112);
        auVar107 = vshufps_avx(auVar78,auVar112,8);
        auVar78 = ZEXT416((uint)(auVar112._0_4_ * auVar150._0_4_ - auVar140._0_4_ * auVar224._0_4_))
        ;
        auVar224 = vshufps_avx(auVar78,auVar78,0);
        auVar78 = vdivps_avx(auVar118,auVar224);
        auVar224 = vdivps_avx(auVar107,auVar224);
        auVar107 = vinsertps_avx(auVar262,auVar316,0x1c);
        auVar140 = vinsertps_avx(auVar272,auVar326,0x1c);
        auVar108 = vinsertps_avx(auVar316,auVar262,0x4c);
        auVar238 = vinsertps_avx(auVar326,auVar272,0x4c);
        auVar150 = vmovsldup_avx(auVar78);
        auVar273._0_4_ = auVar107._0_4_ * auVar150._0_4_;
        auVar273._4_4_ = auVar107._4_4_ * auVar150._4_4_;
        auVar273._8_4_ = auVar107._8_4_ * auVar150._8_4_;
        auVar273._12_4_ = auVar107._12_4_ * auVar150._12_4_;
        auVar113._0_4_ = auVar150._0_4_ * auVar140._0_4_;
        auVar113._4_4_ = auVar150._4_4_ * auVar140._4_4_;
        auVar113._8_4_ = auVar150._8_4_ * auVar140._8_4_;
        auVar113._12_4_ = auVar150._12_4_ * auVar140._12_4_;
        auVar118 = vminps_avx(auVar273,auVar113);
        auVar150 = vmaxps_avx(auVar113,auVar273);
        auVar9 = vmovsldup_avx(auVar224);
        auVar327._0_4_ = auVar9._0_4_ * auVar108._0_4_;
        auVar327._4_4_ = auVar9._4_4_ * auVar108._4_4_;
        auVar327._8_4_ = auVar9._8_4_ * auVar108._8_4_;
        auVar327._12_4_ = auVar9._12_4_ * auVar108._12_4_;
        auVar274._0_4_ = auVar9._0_4_ * auVar238._0_4_;
        auVar274._4_4_ = auVar9._4_4_ * auVar238._4_4_;
        auVar274._8_4_ = auVar9._8_4_ * auVar238._8_4_;
        auVar274._12_4_ = auVar9._12_4_ * auVar238._12_4_;
        auVar9 = vminps_avx(auVar327,auVar274);
        auVar176._0_4_ = auVar118._0_4_ + auVar9._0_4_;
        auVar176._4_4_ = auVar118._4_4_ + auVar9._4_4_;
        auVar176._8_4_ = auVar118._8_4_ + auVar9._8_4_;
        auVar176._12_4_ = auVar118._12_4_ + auVar9._12_4_;
        auVar118 = vmaxps_avx(auVar274,auVar327);
        auVar9 = vsubps_avx(auVar282,auVar162);
        auVar100 = vsubps_avx(auVar292,auVar162);
        auVar114._0_4_ = auVar118._0_4_ + auVar150._0_4_;
        auVar114._4_4_ = auVar118._4_4_ + auVar150._4_4_;
        auVar114._8_4_ = auVar118._8_4_ + auVar150._8_4_;
        auVar114._12_4_ = auVar118._12_4_ + auVar150._12_4_;
        auVar293._8_8_ = 0x3f800000;
        auVar293._0_8_ = 0x3f800000;
        auVar150 = vsubps_avx(auVar293,auVar114);
        auVar118 = vsubps_avx(auVar293,auVar176);
        fVar217 = auVar9._0_4_;
        auVar294._0_4_ = fVar217 * auVar150._0_4_;
        fVar239 = auVar9._4_4_;
        auVar294._4_4_ = fVar239 * auVar150._4_4_;
        fVar187 = auVar9._8_4_;
        auVar294._8_4_ = fVar187 * auVar150._8_4_;
        fVar188 = auVar9._12_4_;
        auVar294._12_4_ = fVar188 * auVar150._12_4_;
        fVar215 = auVar100._0_4_;
        auVar115._0_4_ = fVar215 * auVar150._0_4_;
        fVar236 = auVar100._4_4_;
        auVar115._4_4_ = fVar236 * auVar150._4_4_;
        fVar216 = auVar100._8_4_;
        auVar115._8_4_ = fVar216 * auVar150._8_4_;
        fVar237 = auVar100._12_4_;
        auVar115._12_4_ = fVar237 * auVar150._12_4_;
        auVar317._0_4_ = fVar217 * auVar118._0_4_;
        auVar317._4_4_ = fVar239 * auVar118._4_4_;
        auVar317._8_4_ = fVar187 * auVar118._8_4_;
        auVar317._12_4_ = fVar188 * auVar118._12_4_;
        auVar177._0_4_ = fVar215 * auVar118._0_4_;
        auVar177._4_4_ = fVar236 * auVar118._4_4_;
        auVar177._8_4_ = fVar216 * auVar118._8_4_;
        auVar177._12_4_ = fVar237 * auVar118._12_4_;
        auVar150 = vminps_avx(auVar294,auVar317);
        auVar118 = vminps_avx(auVar115,auVar177);
        auVar9 = vminps_avx(auVar150,auVar118);
        auVar150 = vmaxps_avx(auVar317,auVar294);
        auVar118 = vmaxps_avx(auVar177,auVar115);
        auVar100 = vshufps_avx(auVar162,auVar162,0x54);
        auVar118 = vmaxps_avx(auVar118,auVar150);
        auVar101 = vshufps_avx(auVar305,auVar305,0);
        auVar132 = vshufps_avx(auVar305,auVar305,0x55);
        auVar150 = vhaddps_avx(auVar9,auVar9);
        auVar118 = vhaddps_avx(auVar118,auVar118);
        auVar178._0_4_ = auVar132._0_4_ * auVar224._0_4_ + auVar101._0_4_ * auVar78._0_4_;
        auVar178._4_4_ = auVar132._4_4_ * auVar224._4_4_ + auVar101._4_4_ * auVar78._4_4_;
        auVar178._8_4_ = auVar132._8_4_ * auVar224._8_4_ + auVar101._8_4_ * auVar78._8_4_;
        auVar178._12_4_ = auVar132._12_4_ * auVar224._12_4_ + auVar101._12_4_ * auVar78._12_4_;
        auVar9 = vsubps_avx(auVar100,auVar178);
        fVar214 = auVar9._0_4_ + auVar150._0_4_;
        fVar235 = auVar9._0_4_ + auVar118._0_4_;
        auVar150 = vmaxss_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar214));
        auVar118 = vminss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar219));
      } while (auVar118._0_4_ < auVar150._0_4_);
      auVar150 = vmovshdup_avx(auVar78);
      auVar179._0_4_ = auVar107._0_4_ * auVar150._0_4_;
      auVar179._4_4_ = auVar107._4_4_ * auVar150._4_4_;
      auVar179._8_4_ = auVar107._8_4_ * auVar150._8_4_;
      auVar179._12_4_ = auVar107._12_4_ * auVar150._12_4_;
      auVar116._0_4_ = auVar150._0_4_ * auVar140._0_4_;
      auVar116._4_4_ = auVar150._4_4_ * auVar140._4_4_;
      auVar116._8_4_ = auVar150._8_4_ * auVar140._8_4_;
      auVar116._12_4_ = auVar150._12_4_ * auVar140._12_4_;
      auVar118 = vminps_avx(auVar179,auVar116);
      auVar150 = vmaxps_avx(auVar116,auVar179);
      auVar107 = vmovshdup_avx(auVar224);
      auVar84._0_4_ = auVar107._0_4_ * auVar108._0_4_;
      auVar84._4_4_ = auVar107._4_4_ * auVar108._4_4_;
      auVar84._8_4_ = auVar107._8_4_ * auVar108._8_4_;
      auVar84._12_4_ = auVar107._12_4_ * auVar108._12_4_;
      auVar180._0_4_ = auVar238._0_4_ * auVar107._0_4_;
      auVar180._4_4_ = auVar238._4_4_ * auVar107._4_4_;
      auVar180._8_4_ = auVar238._8_4_ * auVar107._8_4_;
      auVar180._12_4_ = auVar238._12_4_ * auVar107._12_4_;
      auVar107 = vminps_avx(auVar84,auVar180);
      auVar148._0_4_ = auVar118._0_4_ + auVar107._0_4_;
      auVar148._4_4_ = auVar118._4_4_ + auVar107._4_4_;
      auVar148._8_4_ = auVar118._8_4_ + auVar107._8_4_;
      auVar148._12_4_ = auVar118._12_4_ + auVar107._12_4_;
      auVar118 = vmaxps_avx(auVar180,auVar84);
      auVar85._0_4_ = auVar150._0_4_ + auVar118._0_4_;
      auVar85._4_4_ = auVar150._4_4_ + auVar118._4_4_;
      auVar85._8_4_ = auVar150._8_4_ + auVar118._8_4_;
      auVar85._12_4_ = auVar150._12_4_ + auVar118._12_4_;
      auVar150 = vsubps_avx(auVar228,auVar85);
      auVar118 = vsubps_avx(auVar228,auVar148);
      auVar149._0_4_ = fVar217 * auVar150._0_4_;
      auVar149._4_4_ = fVar239 * auVar150._4_4_;
      auVar149._8_4_ = fVar187 * auVar150._8_4_;
      auVar149._12_4_ = fVar188 * auVar150._12_4_;
      auVar181._0_4_ = fVar217 * auVar118._0_4_;
      auVar181._4_4_ = fVar239 * auVar118._4_4_;
      auVar181._8_4_ = fVar187 * auVar118._8_4_;
      auVar181._12_4_ = fVar188 * auVar118._12_4_;
      auVar86._0_4_ = fVar215 * auVar150._0_4_;
      auVar86._4_4_ = fVar236 * auVar150._4_4_;
      auVar86._8_4_ = fVar216 * auVar150._8_4_;
      auVar86._12_4_ = fVar237 * auVar150._12_4_;
      auVar117._0_4_ = fVar215 * auVar118._0_4_;
      auVar117._4_4_ = fVar236 * auVar118._4_4_;
      auVar117._8_4_ = fVar216 * auVar118._8_4_;
      auVar117._12_4_ = fVar237 * auVar118._12_4_;
      auVar150 = vminps_avx(auVar149,auVar181);
      auVar118 = vminps_avx(auVar86,auVar117);
      auVar150 = vminps_avx(auVar150,auVar118);
      auVar118 = vmaxps_avx(auVar181,auVar149);
      auVar107 = vmaxps_avx(auVar117,auVar86);
      auVar150 = vhaddps_avx(auVar150,auVar150);
      auVar118 = vmaxps_avx(auVar107,auVar118);
      auVar118 = vhaddps_avx(auVar118,auVar118);
      auVar107 = vmovshdup_avx(auVar9);
      auVar140 = ZEXT416((uint)(auVar107._0_4_ + auVar150._0_4_));
      auVar150 = vmaxss_avx(auVar230,auVar140);
      auVar107 = ZEXT416((uint)(auVar107._0_4_ + auVar118._0_4_));
      auVar118 = vminss_avx(auVar107,auVar73);
      auVar318._8_4_ = 0x7fffffff;
      auVar318._0_8_ = 0x7fffffff7fffffff;
      auVar318._12_4_ = 0x7fffffff;
    } while (auVar118._0_4_ < auVar150._0_4_);
    uVar70 = 0;
    if ((fVar234 < fVar214) && (fVar235 < fVar219)) {
      auVar150 = vcmpps_avx(auVar107,auVar73,1);
      auVar118 = vcmpps_avx(auVar230,auVar140,1);
      auVar150 = vandps_avx(auVar118,auVar150);
      uVar70 = auVar150._0_4_;
    }
    if ((3 < uVar72 || fVar213 < 0.001) || (uVar70 & 1) != 0) {
      lVar71 = 200;
      do {
        fVar213 = auVar9._0_4_;
        fVar219 = 1.0 - fVar213;
        auVar150 = ZEXT416((uint)(fVar219 * fVar219 * fVar219));
        auVar150 = vshufps_avx(auVar150,auVar150,0);
        auVar118 = ZEXT416((uint)(fVar213 * 3.0 * fVar219 * fVar219));
        auVar118 = vshufps_avx(auVar118,auVar118,0);
        auVar107 = ZEXT416((uint)(fVar219 * fVar213 * fVar213 * 3.0));
        auVar107 = vshufps_avx(auVar107,auVar107,0);
        auVar140 = ZEXT416((uint)(fVar213 * fVar213 * fVar213));
        auVar140 = vshufps_avx(auVar140,auVar140,0);
        fVar219 = local_630 * auVar150._0_4_ +
                  local_590 * auVar118._0_4_ +
                  (float)local_4c0._0_4_ * auVar140._0_4_ + local_5a0 * auVar107._0_4_;
        fVar213 = fStack_62c * auVar150._4_4_ +
                  fStack_58c * auVar118._4_4_ +
                  (float)local_4c0._4_4_ * auVar140._4_4_ + fStack_59c * auVar107._4_4_;
        auVar87._0_8_ = CONCAT44(fVar213,fVar219);
        auVar87._8_4_ =
             fStack_628 * auVar150._8_4_ +
             fStack_588 * auVar118._8_4_ + fStack_4b8 * auVar140._8_4_ + fStack_598 * auVar107._8_4_
        ;
        auVar87._12_4_ =
             fStack_624 * auVar150._12_4_ +
             fStack_584 * auVar118._12_4_ +
             fStack_4b4 * auVar140._12_4_ + fStack_594 * auVar107._12_4_;
        auVar119._8_8_ = auVar87._0_8_;
        auVar119._0_8_ = auVar87._0_8_;
        auVar118 = vshufpd_avx(auVar87,auVar87,1);
        auVar150 = vmovshdup_avx(auVar9);
        auVar118 = vsubps_avx(auVar118,auVar119);
        auVar88._0_4_ = auVar150._0_4_ * auVar118._0_4_ + fVar219;
        auVar88._4_4_ = auVar150._4_4_ * auVar118._4_4_ + fVar213;
        auVar88._8_4_ = auVar150._8_4_ * auVar118._8_4_ + fVar219;
        auVar88._12_4_ = auVar150._12_4_ * auVar118._12_4_ + fVar213;
        auVar150 = vshufps_avx(auVar88,auVar88,0);
        auVar118 = vshufps_avx(auVar88,auVar88,0x55);
        auVar120._0_4_ = auVar78._0_4_ * auVar150._0_4_ + auVar224._0_4_ * auVar118._0_4_;
        auVar120._4_4_ = auVar78._4_4_ * auVar150._4_4_ + auVar224._4_4_ * auVar118._4_4_;
        auVar120._8_4_ = auVar78._8_4_ * auVar150._8_4_ + auVar224._8_4_ * auVar118._8_4_;
        auVar120._12_4_ = auVar78._12_4_ * auVar150._12_4_ + auVar224._12_4_ * auVar118._12_4_;
        auVar9 = vsubps_avx(auVar9,auVar120);
        auVar150 = vandps_avx(auVar318,auVar88);
        auVar118 = vshufps_avx(auVar150,auVar150,0xf5);
        auVar150 = vmaxss_avx(auVar118,auVar150);
        if (auVar150._0_4_ < (float)local_4d0._0_4_) {
          fVar219 = auVar9._0_4_;
          if ((0.0 <= fVar219) && (fVar219 <= 1.0)) {
            auVar78 = vmovshdup_avx(auVar9);
            fVar213 = auVar78._0_4_;
            if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
              auVar78 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar238 = vinsertps_avx(auVar78,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar78 = vdpps_avx(auVar238,local_3a0,0x7f);
              auVar224 = vdpps_avx(auVar238,local_3b0,0x7f);
              auVar150 = vdpps_avx(auVar238,local_3e0,0x7f);
              auVar118 = vdpps_avx(auVar238,local_3f0,0x7f);
              auVar107 = vdpps_avx(auVar238,local_400,0x7f);
              auVar140 = vdpps_avx(auVar238,local_410,0x7f);
              fVar236 = 1.0 - fVar213;
              auVar108 = vdpps_avx(auVar238,local_3c0,0x7f);
              auVar238 = vdpps_avx(auVar238,local_3d0,0x7f);
              fVar216 = 1.0 - fVar219;
              fVar234 = auVar9._4_4_;
              fVar214 = auVar9._8_4_;
              fVar235 = auVar9._12_4_;
              fVar215 = fVar216 * fVar219 * fVar219 * 3.0;
              auVar207._0_4_ = fVar219 * fVar219 * fVar219;
              auVar207._4_4_ = fVar234 * fVar234 * fVar234;
              auVar207._8_4_ = fVar214 * fVar214 * fVar214;
              auVar207._12_4_ = fVar235 * fVar235 * fVar235;
              fVar234 = fVar219 * 3.0 * fVar216 * fVar216;
              fVar214 = fVar216 * fVar216 * fVar216;
              fVar219 = (fVar236 * auVar78._0_4_ + fVar213 * auVar150._0_4_) * fVar214 +
                        (fVar236 * auVar224._0_4_ + fVar213 * auVar118._0_4_) * fVar234 +
                        fVar215 * (fVar236 * auVar108._0_4_ + fVar213 * auVar107._0_4_) +
                        auVar207._0_4_ * (auVar140._0_4_ * fVar213 + fVar236 * auVar238._0_4_);
              if ((fVar192 <= fVar219) &&
                 (fVar213 = *(float *)(ray + k * 4 + 0x100), fVar219 <= fVar213)) {
                pGVar11 = (context->scene->geometries).items[uVar67].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_0106d22c:
                  bVar64 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar64 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar9,auVar9,0x55);
                  auVar263._8_4_ = 0x3f800000;
                  auVar263._0_8_ = 0x3f8000003f800000;
                  auVar263._12_4_ = 0x3f800000;
                  auVar78 = vsubps_avx(auVar263,local_f0);
                  fVar235 = local_f0._0_4_;
                  fVar236 = local_f0._4_4_;
                  fVar237 = local_f0._8_4_;
                  fVar217 = local_f0._12_4_;
                  fVar239 = auVar78._0_4_;
                  fVar187 = auVar78._4_4_;
                  fVar188 = auVar78._8_4_;
                  fVar189 = auVar78._12_4_;
                  auVar275._0_4_ =
                       fVar235 * (float)local_4f0._0_4_ + fVar239 * (float)local_4e0._0_4_;
                  auVar275._4_4_ =
                       fVar236 * (float)local_4f0._4_4_ + fVar187 * (float)local_4e0._4_4_;
                  auVar275._8_4_ = fVar237 * fStack_4e8 + fVar188 * fStack_4d8;
                  auVar275._12_4_ = fVar217 * fStack_4e4 + fVar189 * fStack_4d4;
                  auVar283._0_4_ =
                       fVar235 * (float)local_540._0_4_ + fVar239 * (float)local_520._0_4_;
                  auVar283._4_4_ =
                       fVar236 * (float)local_540._4_4_ + fVar187 * (float)local_520._4_4_;
                  auVar283._8_4_ = fVar237 * fStack_538 + fVar188 * fStack_518;
                  auVar283._12_4_ = fVar217 * fStack_534 + fVar189 * fStack_514;
                  auVar295._0_4_ =
                       fVar235 * (float)local_430._0_4_ + fVar239 * (float)local_530._0_4_;
                  auVar295._4_4_ =
                       fVar236 * (float)local_430._4_4_ + fVar187 * (float)local_530._4_4_;
                  auVar295._8_4_ = fVar237 * fStack_428 + fVar188 * fStack_528;
                  auVar295._12_4_ = fVar217 * fStack_424 + fVar189 * fStack_524;
                  auVar264._0_4_ =
                       fVar235 * (float)local_510._0_4_ + fVar239 * (float)local_500._0_4_;
                  auVar264._4_4_ =
                       fVar236 * (float)local_510._4_4_ + fVar187 * (float)local_500._4_4_;
                  auVar264._8_4_ = fVar237 * fStack_508 + fVar188 * fStack_4f8;
                  auVar264._12_4_ = fVar217 * fStack_504 + fVar189 * fStack_4f4;
                  auVar118 = vsubps_avx(auVar283,auVar275);
                  auVar107 = vsubps_avx(auVar295,auVar283);
                  auVar140 = vsubps_avx(auVar264,auVar295);
                  local_110 = vshufps_avx(auVar9,auVar9,0);
                  fVar235 = local_110._0_4_;
                  fVar237 = local_110._4_4_;
                  fVar217 = local_110._8_4_;
                  fVar187 = local_110._12_4_;
                  auVar78 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
                  fVar236 = auVar78._0_4_;
                  fVar216 = auVar78._4_4_;
                  fVar239 = auVar78._8_4_;
                  fVar188 = auVar78._12_4_;
                  auVar78 = vshufps_avx(auVar207,auVar207,0);
                  auVar224 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                  auVar150 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
                  auVar182._0_4_ =
                       ((auVar107._0_4_ * fVar236 + auVar140._0_4_ * fVar235) * fVar235 +
                       (auVar118._0_4_ * fVar236 + auVar107._0_4_ * fVar235) * fVar236) * 3.0;
                  auVar182._4_4_ =
                       ((auVar107._4_4_ * fVar216 + auVar140._4_4_ * fVar237) * fVar237 +
                       (auVar118._4_4_ * fVar216 + auVar107._4_4_ * fVar237) * fVar216) * 3.0;
                  auVar182._8_4_ =
                       ((auVar107._8_4_ * fVar239 + auVar140._8_4_ * fVar217) * fVar217 +
                       (auVar118._8_4_ * fVar239 + auVar107._8_4_ * fVar217) * fVar239) * 3.0;
                  auVar182._12_4_ =
                       ((auVar107._12_4_ * fVar188 + auVar140._12_4_ * fVar187) * fVar187 +
                       (auVar118._12_4_ * fVar188 + auVar107._12_4_ * fVar187) * fVar188) * 3.0;
                  auVar118 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
                  auVar121._0_4_ =
                       auVar118._0_4_ * (float)local_440._0_4_ +
                       auVar150._0_4_ * (float)local_450._0_4_ +
                       auVar78._0_4_ * (float)local_470._0_4_ +
                       auVar224._0_4_ * (float)local_460._0_4_;
                  auVar121._4_4_ =
                       auVar118._4_4_ * (float)local_440._4_4_ +
                       auVar150._4_4_ * (float)local_450._4_4_ +
                       auVar78._4_4_ * (float)local_470._4_4_ +
                       auVar224._4_4_ * (float)local_460._4_4_;
                  auVar121._8_4_ =
                       auVar118._8_4_ * fStack_438 +
                       auVar150._8_4_ * fStack_448 +
                       auVar78._8_4_ * fStack_468 + auVar224._8_4_ * fStack_458;
                  auVar121._12_4_ =
                       auVar118._12_4_ * fStack_434 +
                       auVar150._12_4_ * fStack_444 +
                       auVar78._12_4_ * fStack_464 + auVar224._12_4_ * fStack_454;
                  auVar78 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar151._0_4_ = auVar121._0_4_ * auVar78._0_4_;
                  auVar151._4_4_ = auVar121._4_4_ * auVar78._4_4_;
                  auVar151._8_4_ = auVar121._8_4_ * auVar78._8_4_;
                  auVar151._12_4_ = auVar121._12_4_ * auVar78._12_4_;
                  auVar78 = vshufps_avx(auVar121,auVar121,0xc9);
                  auVar122._0_4_ = auVar182._0_4_ * auVar78._0_4_;
                  auVar122._4_4_ = auVar182._4_4_ * auVar78._4_4_;
                  auVar122._8_4_ = auVar182._8_4_ * auVar78._8_4_;
                  auVar122._12_4_ = auVar182._12_4_ * auVar78._12_4_;
                  auVar78 = vsubps_avx(auVar122,auVar151);
                  local_170 = vshufps_avx(auVar78,auVar78,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar78,auVar78,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar78,auVar78,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_320._0_8_;
                  uStack_d8 = local_320._8_8_;
                  uStack_d0 = local_320._16_8_;
                  uStack_c8 = local_320._24_8_;
                  local_c0 = local_300._0_8_;
                  uStack_b8 = local_300._8_8_;
                  uStack_b0 = local_300._16_8_;
                  uStack_a8 = local_300._24_8_;
                  auVar89 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar219;
                  local_560 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar69 & 0xf) << 4));
                  local_550 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar69 >> 4) * 0x10);
                  local_4a0.valid = (int *)local_560;
                  local_4a0.geometryUserPtr = pGVar11->userPtr;
                  local_4a0.context = context->user;
                  local_4a0.ray = (RTCRayN *)ray;
                  local_4a0.hit = local_180;
                  local_4a0.N = 8;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->occlusionFilterN)(&local_4a0);
                  }
                  auVar150 = ZEXT816(0) << 0x40;
                  auVar78 = vpcmpeqd_avx(local_560,auVar150);
                  auVar224 = vpcmpeqd_avx(local_550,auVar150);
                  auVar157._16_16_ = auVar224;
                  auVar157._0_16_ = auVar78;
                  auVar15 = auVar89 & ~auVar157;
                  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar15 >> 0x7f,0) != '\0') ||
                        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar15 >> 0xbf,0) != '\0') ||
                      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar15[0x1f] < '\0') {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_4a0);
                      auVar150 = ZEXT816(0) << 0x40;
                    }
                    auVar78 = vpcmpeqd_avx(local_560,auVar150);
                    auVar224 = vpcmpeqd_avx(local_550,auVar150);
                    auVar98._16_16_ = auVar224;
                    auVar98._0_16_ = auVar78;
                    auVar131._8_4_ = 0xff800000;
                    auVar131._0_8_ = 0xff800000ff800000;
                    auVar131._12_4_ = 0xff800000;
                    auVar131._16_4_ = 0xff800000;
                    auVar131._20_4_ = 0xff800000;
                    auVar131._24_4_ = 0xff800000;
                    auVar131._28_4_ = 0xff800000;
                    auVar15 = vblendvps_avx(auVar131,*(undefined1 (*) [32])(local_4a0.ray + 0x100),
                                            auVar98);
                    *(undefined1 (*) [32])(local_4a0.ray + 0x100) = auVar15;
                    auVar89 = auVar89 & ~auVar98;
                    if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar89 >> 0x7f,0) != '\0') ||
                          (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar89 >> 0xbf,0) != '\0') ||
                        (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar89[0x1f] < '\0') {
                      bVar64 = 1;
                      goto LAB_0106d22e;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar213;
                  goto LAB_0106d22c;
                }
LAB_0106d22e:
                bVar63 = (bool)(bVar63 | bVar64);
              }
            }
          }
          break;
        }
        lVar71 = lVar71 + -1;
      } while (lVar71 != 0);
      goto LAB_0106c145;
    }
    auVar78 = vinsertps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar219),0x10);
    auVar299 = ZEXT1664(auVar78);
    auVar212 = ZEXT1664(auVar230);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }